

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O3

void __thiscall Spaghetti<UFPC>::FirstScan(Spaghetti<UFPC> *this)

{
  long lVar1;
  char cVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  undefined4 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong local_d0;
  ulong local_b0;
  int local_a8;
  long local_90;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar19 = *(uint *)&pMVar3->field_0x8;
  uVar28 = *(uint *)&pMVar3->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar19 & 0xfffffffe;
  this->o_rows = (uVar19 & 0x80000001) == 1;
  this->e_cols = uVar28 & 0xfffffffe;
  this->o_cols = (uVar28 & 0x80000001) == 1;
  puVar5 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  lVar18 = *(long *)&pMVar3->field_0x10;
  if (uVar19 == 1) {
    lVar29 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar17 = uVar28 - 2;
    uVar19 = 0;
    if (2 < (int)uVar28) {
      uVar28 = 0xfffffffe;
      uVar20 = 0;
LAB_00153a6f:
      uVar19 = (uint)uVar20;
      if (*(char *)(lVar18 + (int)uVar19) == '\0') goto LAB_00153a9f;
      cVar2 = *(char *)(lVar18 + 3 + (long)(int)uVar28);
      puVar5[UFPC::length_] = UFPC::length_;
      uVar28 = UFPC::length_ + 1;
      *(uint *)(lVar29 + (long)(int)uVar19 * 4) = UFPC::length_;
      UFPC::length_ = uVar28;
      uVar28 = uVar19;
      if (cVar2 == '\0') goto LAB_00153b1e;
      while( true ) {
        uVar28 = (int)uVar20 + 2;
        if ((int)uVar17 <= (int)uVar28) break;
        uVar25 = (long)(int)uVar20;
        while (*(char *)(lVar18 + 2 + uVar25) != '\0') {
          if (*(char *)(lVar18 + 3 + uVar25) == '\0') {
            uVar8 = *(undefined4 *)(lVar29 + uVar25 * 4);
            lVar23 = uVar25 + 2;
            goto LAB_00153b1a;
          }
          *(undefined4 *)(lVar29 + 8 + uVar25 * 4) = *(undefined4 *)(lVar29 + uVar25 * 4);
          uVar20 = uVar25 + 2;
          uVar28 = uVar28 + 2;
          lVar23 = uVar25 + 4;
          uVar25 = uVar20;
          if ((long)(ulong)uVar17 <= lVar23) goto LAB_00153dbc;
        }
        uVar20 = (ulong)uVar28;
LAB_00153a9f:
        uVar28 = (uint)uVar20;
        lVar23 = (long)(int)uVar28;
        if (*(char *)(lVar18 + 1 + lVar23) == '\0') goto LAB_00153b05;
        puVar5[UFPC::length_] = UFPC::length_;
        uVar19 = UFPC::length_ + 1;
        *(uint *)(lVar29 + lVar23 * 4) = UFPC::length_;
        UFPC::length_ = uVar19;
      }
LAB_00153dbc:
      lVar23 = (long)(int)uVar28;
      if ((int)uVar17 < (int)uVar28) {
        if (*(char *)(lVar18 + lVar23) == '\0') goto LAB_00153e95;
      }
      else if (*(char *)(lVar18 + lVar23) == '\0') goto LAB_00153e73;
      *(undefined4 *)(lVar29 + lVar23 * 4) = *(undefined4 *)(lVar29 + (long)(int)uVar20 * 4);
      return;
    }
LAB_00153b2d:
    lVar23 = (long)(int)uVar19;
    cVar2 = *(char *)(lVar18 + lVar23);
    if ((int)uVar19 <= (int)uVar17) {
      if (cVar2 != '\0') goto LAB_00153e7b;
LAB_00153e73:
      cVar2 = *(char *)(lVar18 + 1 + lVar23);
    }
    if (cVar2 == '\0') {
LAB_00153e95:
      *(undefined4 *)(lVar29 + lVar23 * 4) = 0;
      return;
    }
LAB_00153e7b:
    puVar5[UFPC::length_] = UFPC::length_;
    uVar19 = UFPC::length_ + 1;
    *(uint *)(lVar29 + lVar23 * 4) = UFPC::length_;
    UFPC::length_ = uVar19;
    return;
  }
  lVar23 = **(long **)&pMVar3->field_0x48;
  lVar29 = lVar18 + lVar23;
  lVar11 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar20 = (long)(int)uVar28 - 2;
  uVar25 = 0;
  local_a8 = (int)uVar20;
  if (2 < (int)uVar28) {
    uVar25 = 0;
    do {
      lVar39 = (long)(int)uVar25;
      if (*(char *)(lVar18 + lVar39) != '\0') goto LAB_00153d3f;
      if (*(char *)(lVar29 + lVar39) != '\0') goto LAB_00153d3f;
LAB_00153bc6:
      iVar22 = (int)uVar25;
      uVar14 = (ulong)iVar22;
      if ((*(char *)(uVar14 + 1 + lVar18) != '\0') || (*(char *)(lVar29 + 1 + uVar14) != '\0')) {
        uVar40 = (ulong)UFPC::length_;
        puVar5[uVar40] = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
LAB_00153bed:
        *(int *)(lVar11 + uVar14 * 4) = (int)uVar40;
LAB_00153c12:
        lVar39 = (long)(int)uVar25;
        uVar25 = lVar39 + 2;
        if ((int)uVar25 < local_a8) {
          if ((*(char *)(lVar18 + uVar25) != '\0') || (*(char *)(lVar29 + uVar25) != '\0')) {
LAB_00153c32:
            lVar39 = (long)(int)uVar25;
            cVar2 = *(char *)(lVar18 + 1 + lVar39);
            *(undefined4 *)(lVar11 + lVar39 * 4) = *(undefined4 *)(lVar11 + -8 + lVar39 * 4);
            if (cVar2 == '\0') {
              do {
                iVar22 = (int)uVar25;
                uVar17 = iVar22 + 2;
                if (local_a8 <= (int)uVar17) {
LAB_00153de4:
                  uVar25 = (ulong)(int)uVar17;
                  if (local_a8 < (int)uVar17) {
                    if ((*(char *)(lVar18 + uVar25) == '\0') && (*(char *)(lVar29 + uVar25) == '\0')
                       ) {
                      *(undefined4 *)(lVar11 + uVar25 * 4) = 0;
                      goto LAB_00153f4f;
                    }
                  }
                  else {
                    if (*(char *)(lVar18 + uVar25) != '\0') {
                      uVar14 = uVar25;
                      if (*(char *)(lVar29 + 1 + (long)iVar22) == '\0') goto LAB_00153e59;
                      goto LAB_00153f46;
                    }
                    if (*(char *)(lVar29 + uVar25) == '\0') {
                      uVar25 = (ulong)uVar17;
                      goto LAB_00153f0d;
                    }
                  }
                  if (*(char *)(lVar29 + 1 + (long)iVar22) == '\0') {
                    puVar5[UFPC::length_] = UFPC::length_;
                    uVar6 = UFPC::length_ + 1;
                    *(uint *)(lVar11 + (long)(int)uVar17 * 4) = UFPC::length_;
                    UFPC::length_ = uVar6;
                  }
                  else {
                    *(undefined4 *)(lVar11 + (long)(int)uVar17 * 4) =
                         *(undefined4 *)(lVar11 + (long)iVar22 * 4);
                  }
                  goto LAB_00153f4f;
                }
                lVar41 = (long)iVar22;
                lVar1 = lVar41 + 2;
                lVar39 = lVar11 + lVar41 * 4;
                lVar10 = lVar18 + lVar23 + 2 + lVar41;
                lVar33 = lVar18 + 2 + lVar41;
                lVar41 = lVar41 << 0x20;
                lVar43 = 0;
                while (*(char *)(lVar33 + lVar43) == '\0') {
                  if (*(char *)(lVar10 + lVar43) == '\0') {
                    uVar25 = (ulong)(uint)((int)lVar1 + (int)lVar43);
                    goto LAB_00153bc6;
                  }
                  if (*(char *)(lVar33 + 1 + lVar43) != '\0') {
                    uVar14 = lVar1 + lVar43;
                    if (*(char *)(lVar43 + -1 + lVar10) == '\0') {
                      uVar40 = (ulong)UFPC::length_;
                      puVar5[uVar40] = UFPC::length_;
                      UFPC::length_ = UFPC::length_ + 1;
                    }
                    else {
                      uVar40 = (ulong)*(uint *)(lVar39 + lVar43 * 4);
                    }
                    uVar25 = uVar14 & 0xffffffff;
                    goto LAB_00153bed;
                  }
                  if (*(char *)(lVar10 + -1 + lVar43) == '\0') {
                    puVar5[UFPC::length_] = UFPC::length_;
                    uVar17 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                  }
                  else {
                    uVar17 = *(uint *)(lVar39 + lVar43 * 4);
                  }
                  *(uint *)(lVar39 + 8 + lVar43 * 4) = uVar17;
                  lVar41 = lVar41 + 0x200000000;
                  lVar7 = lVar1 + lVar43;
                  lVar43 = lVar43 + 2;
                  if ((long)(uVar20 & 0xffffffff) <= lVar7 + 2) {
                    uVar17 = iVar22 + (int)lVar43 + 2;
                    iVar22 = iVar22 + (int)lVar43;
                    goto LAB_00153de4;
                  }
                }
                if (*(char *)(lVar29 + 1 + (lVar41 >> 0x20)) != '\0') goto code_r0x00153cff;
                lVar39 = lVar41 + 0x200000000 >> 0x20;
                uVar25 = lVar1 + lVar43 & 0xffffffff;
LAB_00153d3f:
                cVar2 = *(char *)(lVar18 + 1 + lVar39);
                puVar5[UFPC::length_] = UFPC::length_;
                uVar17 = UFPC::length_ + 1;
                *(uint *)(lVar11 + lVar39 * 4) = UFPC::length_;
                UFPC::length_ = uVar17;
                if (cVar2 != '\0') break;
              } while( true );
            }
            goto LAB_00153c12;
          }
          goto LAB_00153bc6;
        }
        if (local_a8 < (int)uVar25) {
          if ((*(char *)(lVar18 + uVar25) == '\0') && (*(char *)(lVar29 + uVar25) == '\0')) {
            *(undefined4 *)(lVar11 + 8 + lVar39 * 4) = 0;
          }
          else {
            *(undefined4 *)(lVar11 + 8 + lVar39 * 4) = *(undefined4 *)(lVar11 + lVar39 * 4);
          }
        }
        else {
          if ((*(char *)(lVar18 + uVar25) == '\0') && (*(char *)(lVar29 + uVar25) == '\0'))
          goto LAB_00153f0d;
LAB_00153f46:
          *(undefined4 *)(lVar11 + uVar25 * 4) = *(undefined4 *)(lVar11 + -8 + uVar25 * 4);
        }
        goto LAB_00153f4f;
      }
      *(undefined4 *)(lVar11 + (long)iVar22 * 4) = 0;
      uVar25 = (ulong)(iVar22 + 2U);
    } while ((int)(iVar22 + 2U) < local_a8);
  }
  uVar14 = (ulong)(int)uVar25;
  if (local_a8 < (int)uVar25) {
    if ((*(char *)(lVar18 + uVar14) == '\0') && (*(char *)(lVar29 + uVar14) == '\0')) {
      *(undefined4 *)(lVar11 + uVar14 * 4) = 0;
    }
    else {
LAB_00153e59:
      puVar5[UFPC::length_] = UFPC::length_;
      uVar17 = UFPC::length_ + 1;
      *(uint *)(lVar11 + uVar14 * 4) = UFPC::length_;
      UFPC::length_ = uVar17;
    }
  }
  else {
    if ((*(char *)(lVar18 + uVar14) != '\0') || (*(char *)(lVar29 + uVar14) != '\0'))
    goto LAB_00153e59;
LAB_00153f0d:
    lVar23 = (long)(int)uVar25;
    if ((*(char *)(lVar23 + 1 + lVar18) == '\0') && (*(char *)(lVar29 + 1 + lVar23) == '\0')) {
      *(undefined4 *)(lVar11 + lVar23 * 4) = 0;
    }
    else {
      puVar5[UFPC::length_] = UFPC::length_;
      uVar17 = UFPC::length_ + 1;
      *(uint *)(lVar11 + lVar23 * 4) = UFPC::length_;
      UFPC::length_ = uVar17;
    }
  }
LAB_00153f4f:
  if (*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 < 3) {
    if ((uVar19 & 0x80000001) != 1) {
      return;
    }
  }
  else {
    lVar29 = 2;
    lVar23 = 1;
    lVar18 = 3;
    local_90 = 0;
    do {
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar10 = *(long *)&pMVar3->field_0x10;
      lVar33 = **(long **)&pMVar3->field_0x48;
      lVar16 = lVar33 * lVar29;
      lVar11 = lVar10 + lVar16;
      lVar44 = lVar11 - lVar33;
      lVar39 = lVar11 + lVar33;
      lVar41 = *(long *)&pMVar4->field_0x10;
      lVar43 = **(long **)&pMVar4->field_0x48;
      lVar7 = lVar43 * lVar29;
      lVar1 = lVar41 + lVar7;
      lVar24 = lVar1 + lVar43 * -2;
      cVar2 = *(char *)(lVar10 + lVar16);
      if (2 < (int)uVar28) {
        lVar27 = lVar44 - lVar33;
        local_d0 = 0;
        uVar25 = 0;
        if (cVar2 == '\0') goto LAB_001540bf;
LAB_00154030:
        local_d0 = uVar25;
        lVar31 = (long)(int)local_d0;
        if (*(char *)(lVar31 + 1 + lVar44) == '\0') {
          if (*(char *)(lVar11 + 1 + lVar31) != '\0') goto LAB_00154165;
          if (*(char *)(lVar44 + lVar31) != '\0') {
            *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
            goto LAB_00155242;
          }
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar17 = UFPC::length_ + 1;
          *(uint *)(lVar1 + lVar31 * 4) = UFPC::length_;
          UFPC::length_ = uVar17;
          goto LAB_00154551;
        }
        *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
LAB_00156bde:
        iVar22 = (int)local_d0;
        uVar17 = iVar22 + 2;
        if ((int)uVar17 < local_a8) {
          lVar35 = (long)iVar22;
          lVar31 = lVar35 + 2;
          lVar26 = lVar33 * lVar18 + lVar35;
          lVar21 = lVar33 * lVar23 + lVar35;
          lVar45 = lVar43 * local_90 + lVar35 * 4;
          lVar34 = lVar7 + lVar35 * 4;
          lVar36 = lVar35 << 0x20;
          lVar42 = lVar10 + lVar16 + lVar35;
          lVar12 = lVar10 + 2 + lVar21;
          lVar30 = lVar41 + lVar45 + 8;
          lVar9 = lVar41 + lVar34 + 8;
          lVar15 = 0;
          do {
            lVar37 = lVar36 >> 0x1e;
            lVar32 = lVar36 >> 0x20;
            if (*(char *)(lVar42 + 2 + lVar15) == '\0') {
              local_d0 = lVar31 + lVar15;
              if (*(char *)(lVar15 + 2 + lVar26 + lVar10) == '\0') goto LAB_001540e5;
              lVar31 = lVar36 + 0x300000000 >> 0x20;
              lVar42 = lVar36 + 0x100000000 >> 0x20;
              if (*(char *)(lVar11 + lVar31) == '\0') {
                if (*(char *)(lVar39 + lVar42) != '\0') {
                  *(undefined4 *)(lVar34 + lVar41 + 8 + lVar15 * 4) =
                       *(undefined4 *)(lVar1 + lVar37);
                  goto LAB_00154bae;
                }
                if (*(char *)(lVar11 + lVar42) == '\0') {
                  UFPC::P_[UFPC::length_] = UFPC::length_;
                  uVar17 = UFPC::length_ + 1;
                  *(uint *)(lVar34 + lVar41 + 8 + lVar15 * 4) = UFPC::length_;
                  UFPC::length_ = uVar17;
                  goto LAB_00154bae;
                }
                *(undefined4 *)(lVar34 + lVar41 + 8 + lVar15 * 4) = *(undefined4 *)(lVar1 + lVar37);
                goto LAB_00154bae;
              }
              if (*(char *)(lVar11 + lVar42) != '\0') {
                uVar25 = lVar36 + 0x200000000 >> 0x20;
                goto LAB_00156f36;
              }
              if (*(char *)(lVar39 + lVar42) == '\0') {
                uVar25 = local_d0 & 0xffffffff;
                goto LAB_001540f9;
              }
              if (*(char *)(lVar44 + lVar31) != '\0') goto LAB_00156f4e;
              if (*(char *)(lVar44 + 4 + lVar32) != '\0') {
                uVar25 = lVar36 + 0x200000000 >> 0x20;
                goto LAB_001561fc;
              }
              if (*(char *)(lVar15 + 2 + lVar21 + lVar10) != '\0') {
                *(undefined4 *)(lVar9 + lVar15 * 4) =
                     *(undefined4 *)(lVar45 + lVar41 + 8 + lVar15 * 4);
                goto LAB_001547ad;
              }
              *(undefined4 *)(lVar9 + lVar15 * 4) = *(undefined4 *)(lVar1 + lVar32 * 4);
              goto LAB_00155368;
            }
            iVar13 = (int)lVar31;
            if ((*(char *)(lVar42 + 1 + lVar15) != '\0') ||
               (*(char *)(lVar10 + lVar26 + 1 + lVar15) != '\0')) {
              local_d0 = (ulong)(uint)(iVar13 + (int)lVar15);
              goto LAB_0015619b;
            }
            if (*(char *)(lVar12 + 1 + lVar15) == '\0') {
              local_d0 = lVar31 + lVar15;
              if (*(char *)(lVar15 + 3 + lVar16 + lVar35 + lVar10) == '\0') {
                if (*(char *)(lVar15 + 2 + lVar21 + lVar10) != '\0') {
                  *(undefined4 *)(lVar9 + lVar15 * 4) = *(undefined4 *)(lVar30 + lVar15 * 4);
                  local_d0 = local_d0 & 0xffffffff;
                  goto LAB_00155242;
                }
                *(undefined4 *)(lVar34 + lVar41 + 8 + lVar15 * 4) = *(undefined4 *)(lVar24 + lVar37)
                ;
                local_d0 = local_d0 & 0xffffffff;
                goto LAB_00154551;
              }
              cVar2 = *(char *)(lVar15 + 2 + lVar21 + lVar10);
              if (*(char *)(lVar44 + 4 + lVar32) == '\0') {
                if (cVar2 != '\0') {
                  *(undefined4 *)(lVar9 + lVar15 * 4) =
                       *(undefined4 *)(lVar45 + lVar41 + 8 + lVar15 * 4);
                  goto LAB_001547ad;
                }
                *(undefined4 *)(lVar9 + lVar15 * 4) = *(undefined4 *)(lVar24 + lVar32 * 4);
                goto LAB_00155368;
              }
              if (cVar2 == '\0') {
                lVar31 = lVar36 + 0x200000000 >> 0x20;
                goto LAB_00157380;
              }
LAB_001543e2:
              lVar31 = (long)(int)local_d0;
              if (*(char *)(lVar27 + 1 + lVar31) == '\0') {
                uVar17 = UFPC::Merge(*(uint *)(lVar24 + lVar31 * 4),
                                     *(uint *)(lVar24 + 8 + lVar31 * 4));
              }
              else {
                uVar17 = *(uint *)(lVar24 + 8 + lVar31 * 4);
              }
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
LAB_001555ed:
              iVar22 = (int)local_d0;
              uVar17 = iVar22 + 2;
              if ((int)uVar17 < local_a8) {
                lVar9 = (long)iVar22;
                lVar26 = lVar9 << 0x20;
                lVar42 = lVar16 + lVar9 + lVar10;
                lVar12 = lVar42 + 3;
                lVar15 = lVar33 * lVar23 + lVar9 + lVar10;
                lVar31 = lVar41 + lVar43 * local_90 + lVar9 * 4;
                lVar30 = lVar31 + 8;
                lVar45 = lVar7 + lVar9 * 4;
                lVar34 = lVar41 + 8 + lVar45;
                lVar21 = 0;
                while( true ) {
                  lVar35 = lVar26 >> 0x1e;
                  iVar13 = (int)(lVar9 + 2);
                  iVar38 = (int)lVar21;
                  if (*(char *)(lVar42 + 2 + lVar21) == '\0') {
                    if (*(char *)(lVar33 * lVar18 + lVar9 + lVar10 + 2 + lVar21) == '\0') {
                      local_d0 = lVar9 + 2 + lVar21;
                      lVar31 = lVar26 + 0x300000000 >> 0x20;
                      if (*(char *)(lVar11 + lVar31) == '\0') {
                        local_d0 = local_d0 & 0xffffffff;
                        goto LAB_00154233;
                      }
                      if (*(char *)(lVar44 + lVar31) != '\0') {
                        *(undefined4 *)(lVar34 + lVar21 * 4) = *(undefined4 *)(lVar30 + lVar21 * 4);
                        goto LAB_0015410d;
                      }
                      if (*(char *)(lVar44 + 4 + (lVar26 >> 0x20)) == '\0') {
                        *(undefined4 *)(lVar34 + lVar21 * 4) = *(undefined4 *)(lVar30 + lVar21 * 4);
                        local_d0 = local_d0 & 0xffffffff;
                        goto LAB_001547ad;
                      }
                      local_d0 = local_d0 & 0xffffffff;
                      goto LAB_001543e2;
                    }
                    if (*(char *)(lVar12 + lVar21) == '\0') {
                      local_d0 = (ulong)(uint)(iVar13 + iVar38);
                      *(undefined4 *)(lVar45 + lVar41 + 8 + lVar21 * 4) =
                           *(undefined4 *)(lVar1 + lVar35);
                      goto LAB_00154bae;
                    }
                    if (*(char *)(lVar15 + 3 + lVar21) != '\0') {
                      local_d0 = (ulong)(uint)(iVar13 + iVar38);
                      *(undefined4 *)(lVar34 + lVar21 * 4) = *(undefined4 *)(lVar30 + lVar21 * 4);
                      goto LAB_0015410d;
                    }
                  }
                  else {
                    if (*(char *)(lVar15 + 3 + lVar21) != '\0') {
                      local_d0 = (ulong)(uint)(iVar13 + iVar38);
                      *(undefined4 *)(lVar34 + lVar21 * 4) = *(undefined4 *)(lVar30 + lVar21 * 4);
                      goto LAB_00156bde;
                    }
                    if (*(char *)(lVar12 + lVar21) == '\0') {
                      *(undefined4 *)(lVar45 + lVar41 + 8 + lVar21 * 4) =
                           *(undefined4 *)(lVar1 + lVar35);
                      local_d0 = (ulong)(uint)(iVar13 + iVar38);
                      goto LAB_0015626f;
                    }
                  }
                  if (*(char *)(lVar15 + 4 + lVar21) == '\0') break;
                  uVar17 = *(uint *)(lVar31 + 0x10 + lVar21 * 4);
                  if (*(char *)(lVar33 * local_90 + lVar9 + lVar10 + 3 + lVar21) == '\0') {
                    uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar34 + -8 + lVar21 * 4));
                  }
                  *(uint *)(lVar34 + lVar21 * 4) = uVar17;
                  lVar26 = lVar26 + 0x200000000;
                  lVar35 = lVar9 + lVar21;
                  lVar21 = lVar21 + 2;
                  if ((long)uVar20 <= lVar35 + 4) {
                    iVar22 = iVar22 + (int)lVar21;
                    uVar17 = iVar13 + (int)lVar21;
                    goto LAB_0015582e;
                  }
                }
                *(undefined4 *)(lVar45 + lVar41 + 8 + lVar21 * 4) = *(undefined4 *)(lVar1 + lVar35);
                local_d0 = (ulong)(uint)(iVar13 + iVar38);
LAB_00155a1d:
                iVar22 = (int)local_d0;
                uVar17 = iVar22 + 2;
                if ((int)uVar17 < local_a8) {
                  lVar34 = (long)iVar22;
                  lVar31 = lVar34 + 2;
                  lVar26 = lVar34 << 0x20;
                  lVar45 = lVar7 + lVar34 * 4;
                  lVar21 = lVar41 + lVar45 + 8;
                  lVar42 = lVar16 + lVar34 + lVar10;
                  lVar12 = lVar42 + 3;
                  lVar9 = lVar33 * lVar23 + lVar34 + lVar10;
                  lVar15 = 0;
LAB_00155a9f:
                  iVar38 = (int)lVar31;
                  lVar35 = lVar26 >> 0x1e;
                  iVar13 = (int)lVar15;
                  lVar30 = lVar26 >> 0x20;
                  if (*(char *)(lVar42 + 2 + lVar15) == '\0') {
                    if (*(char *)(lVar33 * lVar18 + lVar34 + lVar10 + 2 + lVar15) == '\0') {
                      local_d0 = (ulong)(uint)(iVar38 + iVar13);
                      goto LAB_001554a5;
                    }
                    if (*(char *)(lVar12 + lVar15) == '\0') {
                      *(undefined4 *)(lVar45 + lVar41 + 8 + lVar15 * 4) =
                           *(undefined4 *)(lVar1 + lVar35);
                      local_d0 = (ulong)(uint)(iVar38 + iVar13);
                      goto LAB_00154bae;
                    }
                    if (*(char *)(lVar9 + 3 + lVar15) != '\0') {
                      local_d0 = lVar31 + lVar15;
                      if (*(char *)(lVar15 + 2 + lVar33 * local_90 + lVar34 + lVar10) == '\0') {
                        uVar17 = *(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 8 + lVar15 * 4)
                        ;
                        uVar6 = *(uint *)(lVar1 + lVar35);
                      }
                      else {
                        if (*(char *)(lVar44 + lVar30) != '\0') {
                          uVar25 = lVar26 + 0x200000000 >> 0x20;
                          goto LAB_00155e60;
                        }
                        uVar17 = *(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 8 + lVar15 * 4)
                        ;
                        uVar6 = *(uint *)(lVar1 + lVar30 * 4);
                      }
                      uVar17 = UFPC::Merge(uVar17,uVar6);
                      *(uint *)(lVar21 + lVar15 * 4) = uVar17;
                      goto LAB_0015410d;
                    }
                  }
                  else {
                    if (*(char *)(lVar9 + 3 + lVar15) != '\0') {
                      local_d0 = lVar31 + lVar15;
                      if (*(char *)(lVar15 + 2 + lVar33 * local_90 + lVar34 + lVar10) == '\0') {
                        uVar17 = *(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 8 + lVar15 * 4)
                        ;
                        uVar6 = *(uint *)(lVar1 + lVar35);
                      }
                      else {
                        if (*(char *)(lVar44 + lVar30) != '\0') {
                          uVar25 = lVar26 + 0x200000000 >> 0x20;
LAB_001547f6:
                          uVar17 = *(uint *)(lVar24 + uVar25 * 4);
                          if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
                            uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
                            *(uint *)(lVar1 + uVar25 * 4) = uVar17;
                          }
                          else {
                            *(uint *)(lVar1 + uVar25 * 4) = uVar17;
                          }
                          goto LAB_00156bde;
                        }
                        uVar17 = *(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 8 + lVar15 * 4)
                        ;
                        uVar6 = *(uint *)(lVar1 + lVar30 * 4);
                      }
                      uVar17 = UFPC::Merge(uVar17,uVar6);
                      *(uint *)(lVar21 + lVar15 * 4) = uVar17;
                      goto LAB_00156bde;
                    }
                    if (*(char *)(lVar12 + lVar15) == '\0') goto LAB_00155d44;
                  }
                  if (*(char *)(lVar9 + 4 + lVar15) == '\0') {
                    *(undefined4 *)(lVar21 + lVar15 * 4) =
                         *(undefined4 *)(lVar41 + lVar45 + lVar15 * 4);
                    lVar26 = lVar26 + 0x200000000;
                    lVar30 = lVar31 + lVar15;
                    lVar15 = lVar15 + 2;
                    if ((long)uVar20 <= lVar30 + 2) {
                      iVar22 = iVar22 + (int)lVar15;
                      uVar17 = iVar38 + (int)lVar15;
                      goto LAB_00155b46;
                    }
                    goto LAB_00155a9f;
                  }
                  local_d0 = lVar31 + lVar15;
                  if (*(char *)(lVar27 + 3 + lVar30) == '\0') {
                    uVar17 = UFPC::Merge(*(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 0x10 +
                                                  lVar15 * 4),*(uint *)(lVar1 + lVar30 * 4));
                    *(uint *)(lVar21 + lVar15 * 4) = uVar17;
                  }
                  else {
                    if (*(char *)(lVar15 + 2 + lVar33 * local_90 + lVar34 + lVar10) == '\0') {
                      uVar17 = UFPC::Merge(*(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 0x10
                                                    + lVar15 * 4),*(uint *)(lVar1 + lVar30 * 4));
                    }
                    else {
                      if (*(char *)(lVar44 + lVar30) != '\0') {
                        uVar25 = lVar26 + 0x200000000 >> 0x20;
LAB_00155c84:
                        local_d0 = local_d0 & 0xffffffff;
                        uVar17 = *(uint *)(lVar24 + 8 + uVar25 * 4);
                        if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
                          uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
                          *(uint *)(lVar1 + uVar25 * 4) = uVar17;
                        }
                        else {
                          *(uint *)(lVar1 + uVar25 * 4) = uVar17;
                        }
                        goto LAB_001555ed;
                      }
                      uVar17 = UFPC::Merge(*(uint *)(lVar43 * local_90 + lVar34 * 4 + lVar41 + 0x10
                                                    + lVar15 * 4),*(uint *)(lVar1 + lVar30 * 4));
                    }
                    *(uint *)(lVar21 + lVar15 * 4) = uVar17;
                  }
                  local_d0 = local_d0 & 0xffffffff;
                  goto LAB_001555ed;
                }
LAB_00155b46:
                local_d0 = (ulong)uVar17;
                uVar25 = local_d0;
                if (local_a8 < (int)uVar17) goto LAB_00155b52;
                if (*(char *)(lVar11 + local_d0) == '\0') {
                  if (*(char *)(lVar39 + local_d0) == '\0') {
LAB_00155be3:
                    uVar17 = (uint)local_d0;
                    uVar25 = (ulong)(int)uVar17;
                    if (*(char *)(uVar25 + 1 + lVar11) == '\0') goto LAB_001570cd;
                    cVar2 = *(char *)(lVar44 + 1 + uVar25);
                    goto joined_r0x00155bfa;
                  }
                  if (*(char *)(lVar11 + 3 + (long)iVar22) == '\0') {
                    uVar17 = *(uint *)(lVar1 + (long)iVar22 * 4);
                    goto LAB_00156dbb;
                  }
                }
                lVar11 = (long)iVar22;
                if (*(char *)(lVar44 + 3 + lVar11) == '\0') {
                  uVar17 = *(uint *)(lVar1 + lVar11 * 4);
                }
                else {
                  if (*(char *)(lVar27 + local_d0) != '\0') {
LAB_001565a2:
                    lVar11 = (long)(int)local_d0;
                    if (*(char *)(lVar11 + -2 + lVar44) == '\0') {
LAB_001565c7:
                      uVar17 = *(uint *)(lVar24 + lVar11 * 4);
                    }
                    else {
LAB_001565ad:
                      lVar11 = (long)(int)local_d0;
                      uVar17 = *(uint *)(lVar24 + lVar11 * 4);
                      if (*(char *)(lVar27 + -1 + lVar11) != '\0') {
                        *(uint *)(lVar1 + lVar11 * 4) = uVar17;
                        goto LAB_0015712a;
                      }
                    }
                    uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + lVar11 * 4));
                    *(uint *)(lVar1 + lVar11 * 4) = uVar17;
                    goto LAB_0015712a;
                  }
                  uVar17 = *(uint *)(lVar24 + local_d0 * 4);
                  uVar6 = *(uint *)(lVar1 + lVar11 * 4);
LAB_00155bad:
                  uVar17 = UFPC::Merge(uVar17,uVar6);
                  local_d0 = uVar25;
                }
                *(uint *)(lVar1 + local_d0 * 4) = uVar17;
                goto LAB_0015712a;
              }
LAB_0015582e:
              uVar25 = (ulong)uVar17;
              if (local_a8 < (int)uVar17) {
LAB_00155b52:
                uVar25 = (ulong)(int)uVar25;
                if (*(char *)(lVar11 + uVar25) == '\0') {
LAB_00155b5b:
                  if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_001570fa;
                }
                uVar8 = *(undefined4 *)(lVar1 + -8 + uVar25 * 4);
                goto LAB_00156e8d;
              }
              if (*(char *)(lVar11 + uVar25) == '\0') {
                lVar10 = (long)iVar22;
                cVar2 = *(char *)(lVar11 + 3 + lVar10);
                if (*(char *)(lVar39 + uVar25) == '\0') {
                  if (cVar2 != '\0') goto LAB_0015406b;
                  goto LAB_001570cd;
                }
                if (cVar2 == '\0') goto LAB_00156e88;
              }
              lVar10 = (long)iVar22;
              if (*(char *)(lVar44 + 3 + lVar10) != '\0') goto LAB_0015406b;
              goto LAB_00156e88;
            }
            if (*(char *)(lVar12 + lVar15) == '\0') goto LAB_00156fef;
            *(undefined4 *)(lVar9 + lVar15 * 4) = *(undefined4 *)(lVar30 + lVar15 * 4);
            lVar36 = lVar36 + 0x200000000;
            lVar32 = lVar31 + lVar15;
            lVar15 = lVar15 + 2;
            if ((long)uVar20 <= lVar32 + 2) {
              iVar22 = iVar22 + (int)lVar15;
              uVar17 = iVar13 + (int)lVar15;
              break;
            }
          } while( true );
        }
        uVar25 = (ulong)uVar17;
        if (local_a8 < (int)uVar17) {
          if (*(char *)(lVar11 + uVar25) == '\0') {
            if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_001570fa;
LAB_00156e70:
            if ((*(char *)(lVar39 + (ulong)(iVar22 + 1)) != '\0') ||
               (*(char *)(lVar11 + (ulong)(iVar22 + 1)) != '\0')) goto LAB_00156e85;
            goto LAB_001570d8;
          }
          if ((*(char *)(lVar11 + (ulong)(iVar22 + 1)) == '\0') &&
             (*(char *)(lVar39 + (ulong)(iVar22 + 1)) == '\0')) {
LAB_0015714f:
            if (*(char *)(lVar44 + uVar25) == '\0') {
              uVar8 = *(undefined4 *)(lVar24 + (long)iVar22 * 4);
              goto LAB_00156e8d;
            }
            goto LAB_0015406b;
          }
LAB_00156e85:
          lVar10 = (long)iVar22;
LAB_00156e88:
          uVar8 = *(undefined4 *)(lVar1 + lVar10 * 4);
          goto LAB_00156e8d;
        }
        if (*(char *)(lVar11 + uVar25) == '\0') {
          local_d0 = uVar25;
          if (*(char *)(lVar39 + uVar25) == '\0') {
LAB_001570b8:
            local_d0 = local_d0 & 0xffffffff;
            goto LAB_001570ba;
          }
          if (*(char *)(lVar11 + (ulong)(iVar22 + 3)) == '\0') goto LAB_00156e70;
          if (*(char *)(lVar11 + (ulong)(iVar22 + 1)) != '\0') goto LAB_00156e2e;
          if (*(char *)(lVar39 + (ulong)(iVar22 + 1)) != '\0') {
            if (*(char *)(lVar44 + (ulong)(iVar22 + 3)) == '\0') {
              if (*(char *)(lVar44 + uVar25) == '\0') goto LAB_00156e85;
              goto LAB_0015406b;
            }
            lVar11 = (long)(int)uVar17;
            goto LAB_00156e39;
          }
          goto LAB_00153fef;
        }
        if ((*(char *)(lVar11 + (ulong)(iVar22 + 1)) == '\0') &&
           (*(char *)(lVar39 + (ulong)(iVar22 + 1)) == '\0')) {
          if (*(char *)(lVar44 + 3 + (long)iVar22) == '\0') goto LAB_0015714f;
          if (*(char *)(lVar44 + uVar25) != '\0') goto LAB_0015406b;
          uVar25 = (ulong)(int)uVar17;
LAB_00156da7:
          if (*(char *)(lVar27 + uVar25) == '\0') {
            uVar17 = *(uint *)(lVar24 + -8 + uVar25 * 4);
            uVar6 = *(uint *)(lVar24 + uVar25 * 4);
LAB_00154df4:
            uVar17 = UFPC::Merge(uVar17,uVar6);
          }
          else {
LAB_00156db7:
            uVar17 = *(uint *)(lVar24 + uVar25 * 4);
          }
LAB_00156dbb:
          *(uint *)(lVar1 + uVar25 * 4) = uVar17;
        }
        else {
LAB_00156e2e:
          lVar11 = (long)(int)uVar17;
          if (*(char *)(lVar44 + 1 + lVar11) == '\0') {
            uVar17 = *(uint *)(lVar1 + -8 + lVar11 * 4);
          }
          else {
LAB_00156e39:
            if (*(char *)(lVar44 + lVar11) == '\0') {
              uVar17 = *(uint *)(lVar24 + lVar11 * 4);
              if (*(char *)(lVar27 + lVar11) != '\0') {
                *(uint *)(lVar1 + lVar11 * 4) = uVar17;
                goto LAB_0015712a;
              }
              uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + lVar11 * 4));
            }
            else {
              uVar17 = *(uint *)(lVar24 + lVar11 * 4);
            }
          }
          *(uint *)(lVar1 + lVar11 * 4) = uVar17;
        }
        goto LAB_0015712a;
      }
      if (uVar28 == 2) {
        local_d0 = 0;
        uVar17 = 0;
        if (cVar2 == '\0') {
LAB_00154312:
          uVar17 = (uint)local_d0;
          uVar25 = (ulong)(int)uVar17;
          if (*(char *)(lVar39 + uVar25) == '\0') {
            local_d0 = local_d0 & 0xffffffff;
LAB_001570ba:
            uVar17 = (uint)local_d0;
            if (*(char *)(lVar11 + 1 + (long)(int)uVar17) != '\0') goto LAB_00153fef;
LAB_001570cd:
            uVar25 = (ulong)(int)uVar17;
            if (*(char *)(lVar39 + 1 + uVar25) == '\0') goto LAB_001570fa;
          }
          else if (*(char *)(lVar11 + 1 + uVar25) != '\0') goto LAB_00153fef;
LAB_001570d8:
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar17 = UFPC::length_ + 1;
          *(uint *)(lVar1 + uVar25 * 4) = UFPC::length_;
          UFPC::length_ = uVar17;
        }
        else {
LAB_00153fef:
          uVar25 = (ulong)(int)uVar17;
          if (*(char *)(lVar44 + 1 + uVar25) == '\0') goto LAB_0015405d;
LAB_0015406b:
          uVar8 = *(undefined4 *)(lVar24 + uVar25 * 4);
LAB_00156e8d:
          *(undefined4 *)(lVar1 + uVar25 * 4) = uVar8;
        }
      }
      else {
        uVar17 = 0;
        local_d0 = 0;
        if (cVar2 != '\0') {
LAB_0015405d:
          uVar25 = (ulong)(int)uVar17;
          cVar2 = *(char *)(lVar44 + uVar25);
joined_r0x00155bfa:
          if (cVar2 == '\0') goto LAB_001570d8;
          goto LAB_0015406b;
        }
LAB_001542d3:
        uVar25 = (ulong)(int)local_d0;
        if (*(char *)(lVar39 + uVar25) != '\0') goto LAB_001570d8;
LAB_001570fa:
        *(undefined4 *)(lVar1 + uVar25 * 4) = 0;
      }
LAB_0015712a:
      lVar29 = lVar29 + 2;
      lVar23 = lVar23 + 2;
      local_90 = local_90 + 2;
      lVar18 = lVar18 + 2;
    } while ((int)lVar29 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74);
    if ((this->o_rows & 1U) == 0) {
      return;
    }
  }
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar23 = *(long *)&pMVar3->field_0x10;
  lVar11 = **(long **)&pMVar3->field_0x48;
  lVar10 = (long)(int)(uVar19 - 1);
  lVar18 = lVar23 + lVar11 * lVar10;
  lVar33 = lVar18 - lVar11;
  lVar39 = *(long *)&pMVar4->field_0x10;
  lVar1 = **(long **)&pMVar4->field_0x48;
  lVar29 = lVar39 + lVar1 * lVar10;
  lVar41 = lVar29 + lVar1 * -2;
  uVar19 = 0;
  if (2 < (int)uVar28) {
    lVar45 = lVar33 - lVar11;
    lVar7 = lVar33 + 1;
    lVar43 = lVar41 + 8;
    uVar20 = uVar20 & 0xffffffff;
    lVar44 = lVar1 * lVar10 + lVar39 + 8;
    lVar27 = (lVar10 + -1) * lVar11;
    lVar31 = lVar27 + lVar23 + 4;
    lVar24 = lVar11 * lVar10 + lVar23 + 3;
    lVar16 = lVar11 * (lVar10 + -2) + lVar23 + 3;
    lVar11 = lVar1 * (lVar10 + -2) + lVar39 + 0x10;
    iVar22 = -2;
    uVar25 = 0;
    do {
      lVar39 = (long)(int)uVar25;
      if (*(char *)(lVar18 + lVar39) == '\0') goto LAB_0015775b;
      if (*(char *)((long)iVar22 + 3 + lVar33) != '\0') {
        *(undefined4 *)(lVar29 + lVar39 * 4) = *(undefined4 *)(lVar41 + lVar39 * 4);
        goto LAB_00157f3f;
      }
      if (*(char *)(lVar18 + 3 + (long)iVar22) != '\0') {
LAB_00157775:
        uVar14 = (ulong)(int)uVar25;
        if (*(char *)(lVar33 + 2 + uVar14) != '\0') {
          if (*(char *)(lVar33 + uVar14) != '\0') goto LAB_0015778c;
          goto LAB_00157ab8;
        }
        if (*(char *)(lVar33 + uVar14) == '\0') goto LAB_00157ac3;
LAB_001577ac:
        *(undefined4 *)(lVar29 + uVar14 * 4) = *(undefined4 *)(lVar41 + uVar14 * 4);
        lVar39 = (long)(int)uVar25;
        uVar14 = lVar39 + 2;
        if ((int)uVar14 < local_a8) {
          uVar25 = uVar14;
          if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_00157a6b;
          if (*(char *)(lVar39 + 3 + lVar33) != '\0') {
            if (*(char *)(lVar45 + uVar14) == '\0') {
              uVar19 = UFPC::Merge(*(uint *)(lVar41 + 8 + lVar39 * 4),*(uint *)(lVar29 + lVar39 * 4)
                                  );
              *(uint *)(lVar29 + 8 + lVar39 * 4) = uVar19;
              goto LAB_00157f3f;
            }
LAB_00157de8:
            if (*(char *)(lVar45 + -1 + uVar14) != '\0') goto LAB_00158092;
            uVar19 = *(uint *)(lVar41 + -8 + uVar14 * 4);
            uVar28 = *(uint *)(lVar41 + uVar14 * 4);
            goto LAB_001580de;
          }
          if (*(char *)(lVar18 + 3 + lVar39) != '\0') {
            if (*(char *)(lVar39 + 4 + lVar33) == '\0') goto LAB_00157a44;
            if ((*(char *)(lVar45 + 3 + lVar39) == '\0') || (*(char *)(lVar45 + uVar14) == '\0')) {
              uVar19 = UFPC::Merge(*(uint *)(lVar41 + 0x10 + lVar39 * 4),
                                   *(uint *)(lVar29 + lVar39 * 4));
              *(uint *)(lVar29 + 8 + lVar39 * 4) = uVar19;
              goto LAB_00157ae3;
            }
LAB_00157e83:
            cVar2 = *(char *)(lVar45 + -1 + uVar14);
            uVar19 = *(uint *)(lVar43 + uVar14 * 4);
joined_r0x00157e97:
            if (cVar2 != '\0') {
              *(uint *)(lVar29 + uVar14 * 4) = uVar19;
              uVar14 = uVar25;
              goto LAB_00157ae3;
            }
LAB_00158126:
            uVar28 = *(uint *)(lVar29 + -8 + uVar14 * 4);
            do {
              uVar19 = UFPC::Merge(uVar19,uVar28);
LAB_0015813b:
              *(uint *)(lVar29 + uVar14 * 4) = uVar19;
              uVar14 = uVar25;
LAB_00157ae3:
              iVar22 = (int)uVar14;
              uVar19 = iVar22 + 2;
              if (local_a8 <= (int)uVar19) {
LAB_001582c4:
                if (local_a8 < (int)uVar19) {
                  uVar14 = (ulong)uVar19;
                  goto LAB_001582cd;
                }
                uVar14 = (ulong)(int)uVar19;
                lVar23 = (long)iVar22;
                if (*(char *)(lVar18 + uVar14) == '\0') {
                  if (*(char *)(lVar18 + 3 + lVar23) != '\0') goto LAB_001584e2;
                  goto LAB_0015846a;
                }
                if (*(char *)(lVar33 + 3 + lVar23) != '\0') goto LAB_001584e2;
LAB_001582fd:
                uVar8 = *(undefined4 *)(lVar29 + lVar23 * 4);
                goto LAB_001584e7;
              }
              lVar42 = (long)iVar22;
              lVar12 = lVar42 << 0x20;
              lVar39 = lVar44 + lVar42 * 4;
              lVar1 = lVar31 + lVar42;
              lVar10 = lVar11 + lVar42 * 4;
              lVar34 = 0;
LAB_00157b4c:
              if (*(char *)(lVar24 + lVar42 + -1 + lVar34) != '\0') {
                iVar38 = (int)lVar34;
                iVar13 = (int)(lVar42 + 2);
                if (*(char *)(lVar1 + -1 + lVar34) != '\0') {
                  uVar25 = (ulong)(uint)(iVar13 + iVar38);
                  *(undefined4 *)(lVar39 + lVar34 * 4) = *(undefined4 *)(lVar10 + -8 + lVar34 * 4);
                  goto LAB_00157f3f;
                }
                if (*(char *)(lVar24 + lVar42 + lVar34) != '\0') goto code_r0x00157b6f;
                uVar19 = iVar13 + iVar38;
                *(undefined4 *)(lVar39 + lVar34 * 4) = *(undefined4 *)(lVar29 + (lVar12 >> 0x1e));
LAB_00157e1b:
                uVar25 = (ulong)uVar19;
                goto LAB_00158191;
              }
              uVar25 = lVar42 + 2 + lVar34;
              iVar22 = (int)uVar25;
              lVar39 = lVar12 + 0x300000000 >> 0x20;
              uVar14 = lVar42 + 2 + lVar34;
              if (*(char *)(lVar18 + lVar39) == '\0') goto LAB_00157885;
              if (*(char *)(lVar33 + lVar39) != '\0') {
LAB_00157a81:
                do {
                  *(undefined4 *)(lVar29 + uVar14 * 4) = *(undefined4 *)(lVar41 + uVar14 * 4);
                  uVar14 = (long)(int)uVar25 + 2;
                  if (local_a8 <= (int)uVar14) {
                    if (local_a8 < (int)uVar14) goto LAB_001582cd;
                    if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_0015835a;
LAB_0015831b:
                    if (*(char *)(lVar33 + 1 + uVar14) == '\0') {
                      uVar8 = *(undefined4 *)(lVar29 + -8 + uVar14 * 4);
                      goto LAB_00158376;
                    }
                    if (*(char *)(lVar33 + uVar14) != '\0') goto LAB_00158371;
                    uVar19 = *(uint *)(lVar41 + uVar14 * 4);
                    if (*(char *)(lVar45 + uVar14) != '\0') {
                      *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                      return;
                    }
                    uVar28 = *(uint *)(lVar29 + -8 + uVar14 * 4);
                    goto LAB_00158574;
                  }
                  uVar25 = uVar14;
                  if (*(char *)(lVar18 + uVar14) != '\0') goto LAB_00157ff1;
LAB_0015775b:
                  iVar22 = (int)uVar25;
                  uVar14 = (ulong)iVar22;
                  if (*(char *)(uVar14 + 1 + lVar18) == '\0') {
                    while( true ) {
                      uVar14 = (ulong)iVar22;
LAB_00157885:
                      *(undefined4 *)(lVar29 + uVar14 * 4) = 0;
                      lVar39 = (long)iVar22;
                      uVar14 = lVar39 + 2;
                      if (local_a8 <= (int)uVar14) break;
                      uVar25 = uVar14;
                      if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_0015775b;
                      if (*(char *)(lVar39 + 3 + lVar33) != '\0') {
                        if ((*(char *)(lVar33 + uVar14) == '\0') &&
                           (*(char *)(lVar7 + lVar39) != '\0')) goto LAB_0015808b;
                        *(undefined4 *)(lVar29 + 8 + lVar39 * 4) =
                             *(undefined4 *)(lVar41 + 8 + lVar39 * 4);
                        goto LAB_00157f3f;
                      }
                      if (*(char *)(lVar18 + 3 + lVar39) == '\0') {
                        if (*(char *)(lVar33 + uVar14) == '\0') {
                          if (*(char *)(lVar7 + lVar39) == '\0') {
                            UFPC::P_[UFPC::length_] = UFPC::length_;
                            uVar19 = UFPC::length_ + 1;
                            *(uint *)(lVar29 + 8 + lVar39 * 4) = UFPC::length_;
                            UFPC::length_ = uVar19;
                            goto LAB_00158191;
                          }
                          uVar8 = *(undefined4 *)(lVar41 + lVar39 * 4);
                        }
                        else {
                          uVar8 = *(undefined4 *)(lVar41 + 8 + lVar39 * 4);
                        }
                        *(undefined4 *)(lVar29 + 8 + lVar39 * 4) = uVar8;
                        goto LAB_00158191;
                      }
                      cVar2 = *(char *)(lVar39 + 2 + lVar33);
                      if (*(char *)(lVar39 + 4 + lVar33) != '\0') {
                        if (cVar2 != '\0') goto LAB_0015778c;
                        if (*(char *)(lVar7 + lVar39) == '\0') {
                          *(undefined4 *)(lVar29 + 8 + lVar39 * 4) =
                               *(undefined4 *)(lVar41 + 0x10 + lVar39 * 4);
                        }
                        else {
LAB_0015814b:
                          if ((*(char *)(lVar45 + 1 + uVar14) == '\0') ||
                             (*(char *)(lVar45 + uVar14) == '\0')) {
                            uVar19 = UFPC::Merge(*(uint *)(lVar41 + -8 + uVar14 * 4),
                                                 *(uint *)(lVar41 + 8 + uVar14 * 4));
                          }
                          else {
                            uVar19 = *(uint *)(lVar43 + uVar14 * 4);
                          }
                          *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                          uVar14 = uVar25;
                        }
                        goto LAB_00157ae3;
                      }
                      if (cVar2 != '\0') goto LAB_001577ac;
                      if (*(char *)(lVar7 + lVar39) == '\0') {
                        UFPC::P_[UFPC::length_] = UFPC::length_;
                        uVar19 = UFPC::length_;
                        UFPC::length_ = UFPC::length_ + 1;
                      }
                      else {
                        uVar19 = *(uint *)(lVar41 + lVar39 * 4);
                      }
LAB_001579af:
                      *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                      lVar39 = (long)(int)uVar25;
                      uVar14 = lVar39 + 2;
                      if (local_a8 <= (int)uVar14) {
                        if (local_a8 < (int)uVar14) goto LAB_001582cd;
                        uVar20 = uVar14;
                        if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_00158430;
                        if (*(char *)(lVar33 + 3 + lVar39) != '\0') goto LAB_0015841d;
                        goto LAB_00158552;
                      }
                      uVar25 = uVar14;
                      if (*(char *)(lVar18 + uVar14) != '\0') {
                        if (*(char *)(lVar39 + 3 + lVar33) != '\0') {
                          uVar19 = UFPC::Merge(*(uint *)(lVar41 + 8 + lVar39 * 4),
                                               *(uint *)(lVar29 + lVar39 * 4));
                          *(uint *)(lVar29 + 8 + lVar39 * 4) = uVar19;
                          goto LAB_00157f3f;
                        }
                        if (*(char *)(lVar18 + 3 + lVar39) == '\0') {
                          *(undefined4 *)(lVar29 + 8 + lVar39 * 4) =
                               *(undefined4 *)(lVar29 + lVar39 * 4);
                          goto LAB_00158191;
                        }
                        if (*(char *)(lVar39 + 4 + lVar33) != '\0') {
                          uVar19 = UFPC::Merge(*(uint *)(lVar41 + 0x10 + lVar39 * 4),
                                               *(uint *)(lVar29 + lVar39 * 4));
                          *(uint *)(lVar29 + 8 + lVar39 * 4) = uVar19;
                          goto LAB_00157ae3;
                        }
LAB_00157a44:
                        *(undefined4 *)(lVar29 + 8 + lVar39 * 4) =
                             *(undefined4 *)(lVar29 + lVar39 * 4);
LAB_00157ce9:
                        while( true ) {
                          iVar22 = (int)uVar25;
                          uVar19 = iVar22 + 2;
                          if (local_a8 <= (int)uVar19) break;
                          lVar34 = (long)iVar22;
                          lVar39 = lVar34 + 2;
                          lVar42 = lVar34 << 0x20;
                          lVar1 = lVar44 + lVar34 * 4;
                          lVar10 = lVar31 + lVar34;
                          lVar12 = 0;
                          while( true ) {
                            if (*(char *)(lVar24 + lVar34 + -1 + lVar12) == '\0') {
                              uVar25 = (ulong)(uint)((int)lVar39 + (int)lVar12);
                              goto LAB_00157a6b;
                            }
                            lVar9 = lVar42 >> 0x1e;
                            lVar15 = lVar42 >> 0x20;
                            if (*(char *)(lVar10 + -1 + lVar12) != '\0') break;
                            if (*(char *)(lVar24 + lVar34 + lVar12) == '\0') {
                              uVar19 = (int)lVar39 + (int)lVar12;
                              *(undefined4 *)(lVar1 + lVar12 * 4) = *(undefined4 *)(lVar29 + lVar9);
                              goto LAB_00157e1b;
                            }
                            if (*(char *)(lVar10 + lVar12) != '\0') {
                              if ((*(char *)(lVar12 + lVar16 + lVar34) == '\0') ||
                                 (*(char *)(lVar12 + -1 + lVar16 + lVar34) == '\0')) {
                                uVar19 = *(uint *)(lVar11 + lVar34 * 4 + lVar12 * 4);
                                uVar28 = *(uint *)(lVar29 + lVar9);
                              }
                              else {
                                if (*(char *)(lVar33 + lVar15) != '\0') {
                                  uVar14 = lVar42 + 0x200000000 >> 0x20;
                                  uVar25 = lVar39 + lVar12 & 0xffffffff;
                                  goto LAB_00157e83;
                                }
                                uVar19 = *(uint *)(lVar11 + lVar34 * 4 + lVar12 * 4);
                                uVar28 = *(uint *)(lVar29 + lVar15 * 4);
                              }
                              uVar19 = UFPC::Merge(uVar19,uVar28);
                              *(uint *)(lVar1 + lVar12 * 4) = uVar19;
                              uVar14 = lVar39 + lVar12 & 0xffffffff;
                              goto LAB_00157ae3;
                            }
                            *(undefined4 *)(lVar1 + lVar12 * 4) =
                                 *(undefined4 *)(lVar1 + -8 + lVar12 * 4);
                            lVar42 = lVar42 + 0x200000000;
                            lVar15 = lVar12 + lVar39;
                            lVar12 = lVar12 + 2;
                            if ((long)uVar20 <= lVar15 + 2) {
                              uVar19 = iVar22 + (int)lVar12 + 2;
                              iVar22 = iVar22 + (int)lVar12;
                              goto LAB_00158200;
                            }
                          }
                          if (*(char *)(lVar12 + -1 + lVar16 + lVar34) == '\0') {
                            uVar19 = *(uint *)(lVar11 + lVar34 * 4 + -8 + lVar12 * 4);
                            uVar28 = *(uint *)(lVar29 + lVar9);
                          }
                          else {
                            if (*(char *)(lVar33 + lVar15) != '\0') {
                              uVar14 = lVar42 + 0x200000000 >> 0x20;
                              uVar25 = lVar39 + lVar12 & 0xffffffff;
                              goto LAB_00157de8;
                            }
                            uVar19 = *(uint *)(lVar11 + lVar34 * 4 + -8 + lVar12 * 4);
                            uVar28 = *(uint *)(lVar29 + lVar15 * 4);
                          }
                          uVar19 = UFPC::Merge(uVar19,uVar28);
                          *(uint *)(lVar1 + lVar12 * 4) = uVar19;
                          uVar25 = lVar39 + lVar12 & 0xffffffff;
LAB_00157f3f:
                          iVar22 = (int)uVar25;
                          iVar13 = iVar22 + 2;
                          if (local_a8 <= iVar13) {
LAB_00158272:
                            uVar14 = (ulong)iVar13;
                            if (local_a8 < iVar13) {
                              if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_0015846a;
                              lVar23 = (long)iVar22;
                              if (*(char *)(lVar18 + 1 + lVar23) != '\0') goto LAB_001582fd;
                            }
                            else {
                              if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_0015835a;
                              if (*(char *)(lVar18 + 1 + (long)iVar22) != '\0') goto LAB_0015831b;
                              if (*(char *)(lVar33 + 3 + (long)iVar22) != '\0') {
                                if (*(char *)(lVar33 + uVar14) != '\0') goto LAB_001584e2;
                                goto LAB_001584c1;
                              }
                            }
                            if (*(char *)(lVar33 + uVar14) != '\0') goto LAB_001584e2;
                            uVar8 = *(undefined4 *)(lVar41 + (long)iVar22 * 4);
                            goto LAB_001584e7;
                          }
                          lVar15 = (long)iVar22;
                          lVar39 = lVar15 + 2;
                          lVar1 = lVar11 + lVar15 * 4;
                          lVar10 = lVar23 + lVar27 + 2 + lVar15;
                          lVar34 = lVar24 + lVar15;
                          lVar42 = lVar44 + lVar15 * 4;
                          lVar15 = lVar15 << 0x20;
                          lVar12 = 0;
LAB_00157f92:
                          lVar15 = lVar15 + 0x200000000;
                          iVar13 = (int)lVar39;
                          iVar38 = (int)lVar12;
                          if (*(char *)(lVar34 + -1 + lVar12) == '\0') {
                            uVar25 = (ulong)(uint)(iVar13 + iVar38);
                            goto LAB_0015775b;
                          }
                          if (*(char *)(lVar34 + -2 + lVar12) == '\0') {
                            if (*(char *)(lVar10 + 1 + lVar12) == '\0') {
                              uVar14 = lVar39 + lVar12;
                              if (*(char *)(lVar12 + lVar34) != '\0') {
                                if (*(char *)(lVar12 + 2 + lVar10) != '\0') {
                                  if (*(char *)(lVar12 + lVar10) == '\0') {
                                    uVar25 = uVar14 & 0xffffffff;
                                    uVar14 = lVar15 >> 0x20;
                                    goto LAB_0015814b;
                                  }
                                  uVar25 = uVar14 & 0xffffffff;
                                  goto LAB_0015778c;
                                }
                                if (*(char *)(lVar12 + lVar10) != '\0') {
                                  uVar25 = uVar14 & 0xffffffff;
                                  goto LAB_001577ac;
                                }
                                uVar25 = uVar14 & 0xffffffff;
                                uVar19 = *(uint *)(lVar1 + -0x10 + lVar12 * 4);
                                goto LAB_001579af;
                              }
                              if (*(char *)(lVar12 + lVar10) == '\0') {
                                uVar8 = *(undefined4 *)(lVar1 + -0x10 + lVar12 * 4);
                              }
                              else {
                                uVar8 = *(undefined4 *)(lVar1 + -8 + lVar12 * 4);
                              }
                              *(undefined4 *)(lVar42 + lVar12 * 4) = uVar8;
                              uVar25 = uVar14 & 0xffffffff;
                              goto LAB_00158191;
                            }
                            if (*(char *)(lVar10 + lVar12) != '\0') goto code_r0x00157fb7;
                            uVar14 = lVar15 >> 0x20;
                            uVar25 = (ulong)(uint)(iVar13 + iVar38);
LAB_0015808b:
                            if (*(char *)(lVar45 + uVar14) == '\0') {
                              uVar19 = UFPC::Merge(*(uint *)(lVar41 + -8 + uVar14 * 4),
                                                   *(uint *)(lVar41 + uVar14 * 4));
                            }
                            else {
LAB_00158092:
                              uVar19 = *(uint *)(lVar41 + uVar14 * 4);
                            }
LAB_001580f9:
                            *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                            goto LAB_00157f3f;
                          }
                          uVar25 = (ulong)(uint)(iVar13 + iVar38);
LAB_00157ff1:
                          uVar14 = (ulong)(int)uVar25;
                          if (*(char *)(uVar14 + 1 + lVar33) != '\0') {
                            if (*(char *)(lVar33 + uVar14) != '\0') goto LAB_00158092;
                            uVar19 = *(uint *)(lVar41 + uVar14 * 4);
                            if (*(char *)(lVar45 + uVar14) == '\0') {
                              uVar28 = *(uint *)(lVar29 + -8 + uVar14 * 4);
LAB_001580de:
                              uVar19 = UFPC::Merge(uVar19,uVar28);
                              goto LAB_001580f9;
                            }
                            *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                            goto LAB_00157f3f;
                          }
                          if (*(char *)(lVar18 + 1 + uVar14) == '\0') {
                            *(undefined4 *)(lVar29 + uVar14 * 4) =
                                 *(undefined4 *)(lVar29 + -8 + uVar14 * 4);
                            goto LAB_00158191;
                          }
                          if (*(char *)(uVar14 + 2 + lVar33) != '\0') {
                            if (*(char *)(lVar45 + 1 + uVar14) == '\0') {
                              uVar19 = *(uint *)(lVar41 + 8 + uVar14 * 4);
                              goto LAB_00158126;
                            }
                            if (*(char *)(lVar33 + uVar14) == '\0') {
                              cVar2 = *(char *)(lVar45 + uVar14);
                              uVar19 = *(uint *)(lVar41 + 8 + uVar14 * 4);
                              goto joined_r0x00157e97;
                            }
                            uVar19 = *(uint *)(lVar41 + 8 + uVar14 * 4);
                            goto LAB_0015813b;
                          }
                          *(undefined4 *)(lVar29 + uVar14 * 4) =
                               *(undefined4 *)(lVar29 + -8 + uVar14 * 4);
                        }
LAB_00158200:
                        uVar14 = (ulong)uVar19;
                        if (local_a8 < (int)uVar19) goto LAB_001582cd;
                        uVar14 = (ulong)(int)uVar19;
                        uVar20 = (ulong)uVar19;
                        if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_00158430;
                        lVar18 = (long)iVar22;
                        if (*(char *)(lVar33 + 3 + lVar18) == '\0') {
                          uVar19 = *(uint *)(lVar29 + lVar18 * 4);
                          goto LAB_00158579;
                        }
                        if ((*(char *)(lVar45 + uVar14) != '\0') &&
                           (*(char *)(lVar33 + lVar18) != '\0')) goto LAB_00158252;
                        uVar19 = *(uint *)(lVar41 + uVar14 * 4);
                        uVar28 = *(uint *)(lVar29 + lVar18 * 4);
                        goto LAB_00158574;
                      }
LAB_00157a6b:
                      iVar22 = (int)uVar25;
                      uVar14 = (ulong)iVar22;
                      if (*(char *)(uVar14 + 1 + lVar18) != '\0') {
                        if (*(char *)(lVar33 + 1 + uVar14) != '\0') goto LAB_00157a81;
                        uVar14 = (ulong)iVar22;
                        if (*(char *)(uVar14 + 2 + lVar33) != '\0') goto LAB_00157ab8;
LAB_00157ac3:
                        UFPC::P_[UFPC::length_] = UFPC::length_;
                        uVar19 = UFPC::length_;
                        UFPC::length_ = UFPC::length_ + 1;
                        goto LAB_001579af;
                      }
                    }
                    if (local_a8 < (int)uVar14) {
                      if (*(char *)(lVar18 + uVar14) == '\0') {
                        *(undefined4 *)(lVar29 + 8 + lVar39 * 4) = 0;
                        return;
                      }
LAB_00158535:
                      if (*(char *)(lVar33 + uVar14) == '\0') {
                        if (*(char *)(lVar33 + 1 + lVar39) == '\0') {
                          UFPC::P_[UFPC::length_] = UFPC::length_;
                          uVar19 = UFPC::length_ + 1;
                          *(uint *)(lVar29 + 8 + lVar39 * 4) = UFPC::length_;
                          UFPC::length_ = uVar19;
                          return;
                        }
                        uVar8 = *(undefined4 *)(lVar41 + lVar39 * 4);
                        goto LAB_00158541;
                      }
                    }
                    else {
                      if (*(char *)(lVar18 + uVar14) == '\0') goto LAB_0015835a;
                      if (*(char *)(lVar33 + 3 + lVar39) == '\0') goto LAB_00158535;
                      if ((*(char *)(lVar33 + uVar14) == '\0') &&
                         (*(char *)(lVar33 + 1 + lVar39) != '\0')) {
LAB_001584c1:
                        cVar2 = *(char *)(lVar45 + uVar14);
                        goto joined_r0x001584c6;
                      }
                    }
                    uVar8 = *(undefined4 *)(lVar41 + 8 + lVar39 * 4);
LAB_00158541:
                    *(undefined4 *)(lVar29 + 8 + lVar39 * 4) = uVar8;
                    return;
                  }
                } while (*(char *)(lVar33 + 1 + uVar14) != '\0');
                goto LAB_00157775;
              }
              if (*(char *)(lVar33 + 4 + (lVar12 >> 0x20)) == '\0') goto LAB_001577ac;
LAB_0015778c:
              uVar14 = (ulong)(int)uVar25;
              if (*(char *)(lVar45 + 1 + uVar14) != '\0') {
                uVar19 = *(uint *)(lVar43 + uVar14 * 4);
                goto LAB_0015813b;
              }
              uVar19 = *(uint *)(lVar41 + uVar14 * 4);
              uVar28 = *(uint *)(lVar41 + 8 + uVar14 * 4);
            } while( true );
          }
          *(undefined4 *)(lVar29 + 8 + lVar39 * 4) = *(undefined4 *)(lVar29 + lVar39 * 4);
          goto LAB_00158191;
        }
        if (local_a8 < (int)uVar14) {
LAB_001582cd:
          uVar14 = (ulong)(int)uVar14;
          if (*(char *)(lVar18 + uVar14) == '\0') {
LAB_0015846a:
            *(undefined4 *)(lVar29 + uVar14 * 4) = 0;
            return;
          }
          uVar8 = *(undefined4 *)(lVar29 + -8 + uVar14 * 4);
        }
        else {
          uVar20 = uVar14;
          if (*(char *)(lVar18 + uVar14) != '\0') {
            if (*(char *)(lVar33 + 3 + lVar39) == '\0') {
LAB_00158552:
              uVar19 = *(uint *)(lVar29 + lVar39 * 4);
            }
            else {
              if (*(char *)(lVar45 + uVar14) != '\0') {
LAB_00158252:
                cVar2 = *(char *)(lVar45 + -1 + uVar14);
joined_r0x001584c6:
                if (cVar2 == '\0') {
                  uVar19 = *(uint *)(lVar41 + -8 + uVar14 * 4);
                  uVar28 = *(uint *)(lVar41 + uVar14 * 4);
LAB_00158574:
                  uVar19 = UFPC::Merge(uVar19,uVar28);
LAB_00158579:
                  *(uint *)(lVar29 + uVar14 * 4) = uVar19;
                  return;
                }
                goto LAB_00158371;
              }
LAB_0015841d:
              uVar19 = UFPC::Merge(*(uint *)(lVar41 + 8 + lVar39 * 4),*(uint *)(lVar29 + lVar39 * 4)
                                  );
            }
            *(uint *)(lVar29 + 8 + lVar39 * 4) = uVar19;
            return;
          }
LAB_00158430:
          uVar14 = (ulong)(int)uVar20;
          if (*(char *)(uVar14 + 1 + lVar18) == '\0') goto LAB_0015846a;
          if (*(char *)(lVar33 + 1 + uVar14) == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar19 = UFPC::length_ + 1;
            *(uint *)(lVar29 + uVar14 * 4) = UFPC::length_;
            UFPC::length_ = uVar19;
            return;
          }
LAB_001584e2:
          uVar8 = *(undefined4 *)(lVar41 + uVar14 * 4);
        }
LAB_001584e7:
        *(undefined4 *)(lVar29 + uVar14 * 4) = uVar8;
        return;
      }
      if (*(char *)(lVar33 + lVar39) == '\0') {
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar19 = UFPC::length_ + 1;
        *(uint *)(lVar29 + lVar39 * 4) = UFPC::length_;
        UFPC::length_ = uVar19;
      }
      else {
        *(undefined4 *)(lVar29 + lVar39 * 4) = *(undefined4 *)(lVar41 + lVar39 * 4);
      }
LAB_00158191:
      iVar22 = (int)uVar25;
      uVar19 = iVar22 + 2;
      uVar25 = (ulong)uVar19;
    } while ((int)uVar19 < local_a8);
  }
  uVar14 = (ulong)(int)uVar19;
  if (local_a8 < (int)uVar19) {
    if (*(char *)(lVar18 + uVar14) == '\0') {
LAB_0015837f:
      *(undefined4 *)(lVar29 + uVar14 * 4) = 0;
      return;
    }
  }
  else {
    if (*(char *)(lVar18 + uVar14) == '\0') {
LAB_0015835a:
      if (*(char *)(lVar18 + 1 + uVar14) == '\0') goto LAB_0015837f;
    }
    if (*(char *)(lVar33 + 1 + uVar14) != '\0') goto LAB_00158371;
  }
  if (*(char *)(lVar33 + uVar14) == '\0') {
    UFPC::P_[UFPC::length_] = UFPC::length_;
    uVar19 = UFPC::length_ + 1;
    *(uint *)(lVar29 + uVar14 * 4) = UFPC::length_;
    UFPC::length_ = uVar19;
    return;
  }
LAB_00158371:
  uVar8 = *(undefined4 *)(lVar41 + uVar14 * 4);
LAB_00158376:
  *(undefined4 *)(lVar29 + uVar14 * 4) = uVar8;
  return;
code_r0x00153cff:
  uVar25 = lVar1 + lVar43 & 0xffffffff;
  goto LAB_00153c32;
LAB_00155d44:
  *(undefined4 *)(lVar45 + lVar41 + 8 + lVar15 * 4) = *(undefined4 *)(lVar1 + lVar35);
  local_d0 = (ulong)(uint)(iVar38 + iVar13);
LAB_0015626f:
  do {
    lVar31 = (long)(int)local_d0;
    local_d0 = lVar31 + 2;
    if (local_a8 <= (int)local_d0) {
      uVar14 = local_d0 & 0xffffffff;
      if (local_a8 < (int)local_d0) {
        if (*(char *)(lVar11 + uVar14) == '\0') {
LAB_0015634a:
          iVar22 = (int)local_d0;
          if (*(char *)(lVar39 + uVar14) == '\0') {
            *(undefined4 *)(lVar1 + uVar14 * 4) = 0;
          }
          else {
LAB_00156357:
            lVar11 = (long)iVar22;
            if (*(char *)(lVar39 + -1 + lVar11) == '\0') {
              UFPC::P_[UFPC::length_] = UFPC::length_;
              uVar17 = UFPC::length_ + 1;
              *(uint *)(lVar1 + lVar11 * 4) = UFPC::length_;
              UFPC::length_ = uVar17;
            }
            else {
              *(undefined4 *)(lVar1 + lVar11 * 4) = *(undefined4 *)(lVar1 + -8 + lVar11 * 4);
            }
          }
          goto LAB_0015712a;
        }
        if (*(char *)(lVar39 + 1 + lVar31) == '\0') {
LAB_0015633d:
          uVar25 = local_d0 & 0xffffffff;
LAB_00156340:
          uVar17 = (uint)uVar25;
          goto LAB_0015405d;
        }
LAB_0015659b:
        if (*(char *)(lVar44 + uVar14) != '\0') goto LAB_001565a2;
LAB_001565f2:
        uVar17 = *(uint *)(lVar1 + lVar31 * 4);
      }
      else {
        if (*(char *)(lVar11 + uVar14) == '\0') {
          if (*(char *)(lVar39 + uVar14) == '\0') {
LAB_0015665f:
            local_d0 = local_d0 & 0xffffffff;
            goto LAB_001570ba;
          }
          if (*(char *)(lVar11 + 3 + lVar31) == '\0') {
LAB_00156654:
            iVar22 = (int)local_d0;
            goto LAB_00156357;
          }
        }
        if (*(char *)(lVar39 + 1 + lVar31) == '\0') {
LAB_001563f6:
          uVar17 = (uint)local_d0;
          goto LAB_00153fef;
        }
        if (*(char *)(lVar44 + 3 + lVar31) == '\0') goto LAB_0015659b;
        if (*(char *)(lVar44 + lVar31) != '\0') {
LAB_001563d9:
          lVar11 = (long)(int)local_d0;
          if (*(char *)(lVar27 + -1 + lVar11) == '\0') goto LAB_001565c7;
          goto LAB_00156e39;
        }
        uVar17 = UFPC::Merge(*(uint *)(lVar24 + uVar14 * 4),*(uint *)(lVar1 + lVar31 * 4));
      }
      *(uint *)(lVar1 + uVar14 * 4) = uVar17;
      goto LAB_0015712a;
    }
    if (*(char *)(lVar11 + local_d0) == '\0') {
      if (*(char *)(lVar39 + local_d0) == '\0') goto LAB_0015652c;
      uVar25 = local_d0;
      if (*(char *)(lVar31 + 3 + lVar11) == '\0') goto LAB_00154b6a;
      if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_001540f9;
      if (*(char *)(lVar44 + 3 + lVar31) != '\0') {
        if (*(char *)(lVar44 + lVar31) != '\0') goto LAB_001564bd;
        uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
        goto LAB_0015410d;
      }
    }
    else {
      uVar25 = local_d0;
      if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_00154030;
      if (*(char *)(lVar31 + 3 + lVar44) != '\0') {
        if (*(char *)(lVar44 + lVar31) == '\0') {
          uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
          *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
        }
        else {
LAB_001562af:
          if (*(char *)(lVar27 + -1 + local_d0) == '\0') {
            uVar17 = UFPC::Merge(*(uint *)(lVar24 + local_d0 * 4),
                                 *(uint *)(lVar1 + -8 + local_d0 * 4));
            *(uint *)(lVar1 + local_d0 * 4) = uVar17;
          }
          else {
LAB_001561bb:
            lVar31 = (long)(int)local_d0;
            if (*(char *)(lVar44 + lVar31) == '\0') {
              uVar17 = *(uint *)(lVar24 + lVar31 * 4);
              if (*(char *)(lVar27 + lVar31) == '\0') {
                uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + lVar31 * 4));
                *(uint *)(lVar1 + lVar31 * 4) = uVar17;
              }
              else {
                *(uint *)(lVar1 + lVar31 * 4) = uVar17;
              }
            }
            else {
              *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
            }
          }
        }
        goto LAB_00156bde;
      }
      if (*(char *)(lVar11 + 3 + lVar31) == '\0') {
        if (*(char *)(lVar44 + local_d0) == '\0') goto LAB_0015680e;
        if (*(char *)(lVar44 + lVar31) != '\0') goto LAB_001567dc;
        uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
        goto LAB_00155242;
      }
    }
    if (*(char *)(lVar31 + 4 + lVar44) != '\0') {
      if (*(char *)(lVar27 + 3 + lVar31) != '\0') {
        uVar25 = local_d0;
        if (*(char *)(lVar44 + lVar31) == '\0') {
          uVar17 = UFPC::Merge(*(uint *)(lVar24 + 0x10 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
          *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
        }
        else {
LAB_001566a3:
          local_d0 = uVar25 & 0xffffffff;
          if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
            uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + uVar25 * 4),
                                 *(uint *)(lVar1 + -8 + uVar25 * 4));
LAB_00156560:
            *(uint *)(lVar1 + uVar25 * 4) = uVar17;
          }
          else {
LAB_00156212:
            if (*(char *)(lVar44 + uVar25) == '\0') {
              uVar17 = *(uint *)(lVar24 + 8 + uVar25 * 4);
              if (*(char *)(lVar27 + uVar25) == '\0') {
                uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
                *(uint *)(lVar1 + uVar25 * 4) = uVar17;
              }
              else {
                *(uint *)(lVar1 + uVar25 * 4) = uVar17;
              }
            }
            else {
              *(undefined4 *)(lVar1 + uVar25 * 4) = *(undefined4 *)(lVar24 + 8 + uVar25 * 4);
            }
          }
        }
        goto LAB_001555ed;
      }
      if (*(char *)(lVar44 + local_d0) == '\0') {
LAB_00156980:
        uVar17 = UFPC::Merge(*(uint *)(lVar24 + 0x10 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        local_b0 = local_d0;
      }
      else {
        uVar25 = local_d0;
        if (*(char *)(lVar44 + lVar31) != '\0') {
LAB_0015693b:
          local_d0 = uVar25 & 0xffffffff;
          if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
            uVar17 = UFPC::Merge(*(uint *)(lVar24 + uVar25 * 4),*(uint *)(lVar24 + 8 + uVar25 * 4));
            uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
          }
          else {
            uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + uVar25 * 4),
                                 *(uint *)(lVar1 + -8 + uVar25 * 4));
          }
          *(uint *)(lVar1 + uVar25 * 4) = uVar17;
          goto LAB_001555ed;
        }
        uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),
                             *(uint *)(lVar24 + 0x10 + lVar31 * 4));
        uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + lVar31 * 4));
        local_b0 = local_d0;
      }
      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
      local_d0 = local_b0;
      goto LAB_001555ed;
    }
    if (*(char *)(lVar44 + 2 + lVar31) == '\0') goto LAB_00156862;
    uVar25 = local_d0;
    if (*(char *)(lVar44 + lVar31) == '\0') {
      uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
      goto LAB_001547ad;
    }
LAB_00156830:
    local_d0 = uVar25 & 0xffffffff;
    uVar17 = *(uint *)(lVar24 + uVar25 * 4);
    if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
      uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
      *(uint *)(lVar1 + uVar25 * 4) = uVar17;
    }
    else {
      *(uint *)(lVar1 + uVar25 * 4) = uVar17;
    }
LAB_001547ad:
    lVar31 = (long)(int)local_d0;
    local_d0 = lVar31 + 2;
    if (local_a8 <= (int)local_d0) {
      uVar25 = local_d0;
      if (local_a8 < (int)local_d0) goto LAB_00155b52;
      uVar25 = local_d0 & 0xffffffff;
      if (*(char *)(lVar11 + uVar25) == '\0') {
        if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_00155be3;
        if (*(char *)(lVar11 + 3 + lVar31) != '\0') goto LAB_00154836;
      }
      else {
LAB_00154836:
        if (*(char *)(lVar44 + 3 + lVar31) != '\0') {
          if (*(char *)(lVar27 + uVar25) != '\0') goto LAB_001565ad;
          uVar17 = *(uint *)(lVar24 + uVar25 * 4);
          uVar6 = *(uint *)(lVar1 + lVar31 * 4);
          goto LAB_00155bad;
        }
      }
LAB_00155565:
      uVar17 = *(uint *)(lVar1 + lVar31 * 4);
      goto LAB_00156dbb;
    }
    if (*(char *)(lVar11 + local_d0) != '\0') {
      if (*(char *)(lVar31 + 3 + lVar44) != '\0') {
        uVar25 = local_d0;
        if (*(char *)(lVar27 + local_d0) != '\0') goto LAB_001547f6;
        uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
        goto LAB_00156bde;
      }
      if (*(char *)(lVar11 + 3 + lVar31) == '\0') {
        *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
        local_d0 = local_d0 & 0xffffffff;
        goto LAB_0015626f;
      }
LAB_001548be:
      if (*(char *)(lVar31 + 4 + lVar44) == '\0') {
        *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
LAB_001555e3:
        local_d0 = local_d0 & 0xffffffff;
        goto LAB_00155a1d;
      }
      if (*(char *)(lVar27 + 3 + lVar31) == '\0') {
        uVar17 = UFPC::Merge(*(uint *)(lVar24 + 0x10 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
      }
      else {
        uVar25 = local_d0;
        if (*(char *)(lVar27 + local_d0) != '\0') goto LAB_00155c84;
        uVar17 = UFPC::Merge(*(uint *)(lVar24 + 0x10 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
        *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
      }
      goto LAB_001555ed;
    }
    if (*(char *)(lVar39 + local_d0) == '\0') goto LAB_001554a5;
    if (*(char *)(lVar31 + 3 + lVar11) == '\0') break;
    if (*(char *)(lVar44 + 3 + lVar31) == '\0') goto LAB_001548be;
    uVar25 = local_d0;
    if (*(char *)(lVar27 + local_d0) == '\0') {
      uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
    }
    else {
LAB_00155e60:
      uVar17 = *(uint *)(lVar24 + uVar25 * 4);
      if (*(char *)(lVar27 + -1 + uVar25) == '\0') {
        uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + uVar25 * 4));
        *(uint *)(lVar1 + uVar25 * 4) = uVar17;
      }
      else {
        *(uint *)(lVar1 + uVar25 * 4) = uVar17;
      }
    }
LAB_0015410d:
    lVar31 = (long)(int)local_d0;
    local_d0 = lVar31 + 2;
    uVar17 = (uint)local_d0;
    if (local_a8 <= (int)uVar17) {
      if (local_a8 < (int)uVar17) {
        uVar25 = local_d0 & 0xffffffff;
        goto LAB_00155b52;
      }
      uVar25 = local_d0 & 0xffffffff;
      if (*(char *)(lVar11 + uVar25) != '\0') goto LAB_00156e2e;
      if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_001570b8;
      if (*(char *)(lVar11 + 3 + lVar31) != '\0') goto LAB_00156e2e;
      *(undefined4 *)(lVar1 + uVar25 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
      goto LAB_0015712a;
    }
    if (*(char *)(lVar11 + local_d0) == '\0') {
      if (*(char *)(lVar39 + local_d0) == '\0') goto LAB_001540e5;
      if (*(char *)(lVar11 + 3 + lVar31) == '\0') {
        *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
LAB_00154bae:
        lVar31 = (long)(int)local_d0;
        local_d0 = lVar31 + 2;
        iVar22 = (int)local_d0;
        if (iVar22 < local_a8) {
          if (*(char *)(lVar11 + local_d0) == '\0') {
            uVar25 = local_d0 & 0xffffffff;
            goto LAB_0015463f;
          }
          if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_0015437e;
LAB_00154bdd:
          lVar31 = (long)(int)local_d0;
          if (*(char *)(lVar31 + 1 + lVar44) != '\0') {
            if (*(char *)(lVar44 + lVar31) == '\0') {
              if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
                uVar17 = UFPC::Merge(*(uint *)(lVar24 + lVar31 * 4),
                                     *(uint *)(lVar1 + -8 + lVar31 * 4));
                *(uint *)(lVar1 + lVar31 * 4) = uVar17;
              }
              else {
                if (*(char *)(lVar27 + lVar31) == '\0') {
                  uVar17 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),
                                       *(uint *)(lVar24 + lVar31 * 4));
                  uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
                }
                else {
                  uVar17 = *(uint *)(lVar24 + lVar31 * 4);
                  uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
                }
                uVar17 = UFPC::Merge(uVar17,uVar6);
                *(uint *)(lVar1 + lVar31 * 4) = uVar17;
                local_d0 = local_d0 & 0xffffffff;
              }
            }
            else {
              uVar17 = UFPC::Merge(*(uint *)(lVar24 + lVar31 * 4),*(uint *)(lVar1 + -8 + lVar31 * 4)
                                  );
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
            }
            goto LAB_00156bde;
          }
          if (*(char *)(lVar11 + 1 + lVar31) == '\0') {
            uVar25 = (ulong)(int)local_d0;
            if (*(char *)(lVar44 + -1 + uVar25) == '\0') goto LAB_00155056;
            uVar17 = UFPC::Merge(*(uint *)(lVar24 + -8 + uVar25 * 4),
                                 *(uint *)(lVar1 + -8 + uVar25 * 4));
            *(uint *)(lVar1 + uVar25 * 4) = uVar17;
            goto LAB_0015626f;
          }
          if (*(char *)(lVar31 + 2 + lVar44) == '\0') {
            if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
LAB_00154752:
              if (*(char *)(lVar44 + lVar31) == '\0') {
                *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar1 + -8 + lVar31 * 4);
LAB_00155368:
                do {
                  lVar31 = (long)(int)local_d0;
                  local_d0 = lVar31 + 2;
                  if (local_a8 <= (int)local_d0) {
                    uVar25 = local_d0;
                    if (local_a8 < (int)local_d0) goto LAB_00155b52;
                    uVar25 = local_d0 & 0xffffffff;
                    if (*(char *)(lVar11 + uVar25) == '\0') {
                      if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_00155be3;
                      if (*(char *)(lVar11 + 3 + lVar31) == '\0') goto LAB_00155565;
                    }
                    if (*(char *)(lVar44 + 3 + lVar31) == '\0') goto LAB_00155565;
                    uVar17 = *(uint *)(lVar24 + uVar25 * 4);
                    uVar6 = *(uint *)(lVar1 + lVar31 * 4);
                    goto LAB_00154df4;
                  }
                  if (*(char *)(lVar11 + local_d0) != '\0') {
                    if (*(char *)(lVar31 + 3 + lVar44) != '\0') {
                      uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),
                                           *(uint *)(lVar1 + lVar31 * 4));
                      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
                      goto LAB_00156bde;
                    }
                    if (*(char *)(lVar11 + 3 + lVar31) == '\0') {
                      *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
                      local_d0 = local_d0 & 0xffffffff;
                      goto LAB_0015626f;
                    }
LAB_001554ec:
                    if (*(char *)(lVar31 + 4 + lVar44) != '\0') {
                      uVar17 = UFPC::Merge(*(uint *)(lVar24 + 0x10 + lVar31 * 4),
                                           *(uint *)(lVar1 + lVar31 * 4));
                      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
                      goto LAB_001555ed;
                    }
                    *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
                    goto LAB_001555e3;
                  }
                  if (*(char *)(lVar39 + local_d0) != '\0') {
                    if (*(char *)(lVar31 + 3 + lVar11) == '\0') goto LAB_0015556f;
                    if (*(char *)(lVar44 + 3 + lVar31) == '\0') goto LAB_001554ec;
                    uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),
                                         *(uint *)(lVar1 + lVar31 * 4));
                    *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
                    goto LAB_0015410d;
                  }
LAB_001554a5:
                  lVar31 = (long)(int)local_d0;
                  if (*(char *)(lVar31 + 1 + lVar11) == '\0') goto LAB_001554d9;
                  uVar25 = local_d0;
                  if (*(char *)(lVar44 + 1 + lVar31) != '\0') goto LAB_00154104;
                  if (*(char *)(lVar31 + 2 + lVar44) != '\0') {
                    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + 8 + lVar31 * 4);
                    local_d0 = local_d0 & 0xffffffff;
                    goto LAB_001555ed;
                  }
                  UFPC::P_[UFPC::length_] = UFPC::length_;
                  uVar17 = UFPC::length_ + 1;
                  *(uint *)(lVar1 + lVar31 * 4) = UFPC::length_;
                  UFPC::length_ = uVar17;
                  local_d0 = local_d0 & 0xffffffff;
                } while( true );
              }
              uVar17 = UFPC::Merge(*(uint *)(lVar24 + lVar31 * 4),*(uint *)(lVar1 + -8 + lVar31 * 4)
                                  );
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
              goto LAB_001547ad;
            }
            uVar17 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),
                                 *(uint *)(lVar1 + -8 + lVar31 * 4));
            *(uint *)(lVar1 + lVar31 * 4) = uVar17;
            goto LAB_00155a1d;
          }
          if (*(char *)(lVar44 + lVar31) == '\0') {
            if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
              uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),
                                   *(uint *)(lVar1 + -8 + lVar31 * 4));
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
            }
            else if (*(char *)(lVar27 + 1 + lVar31) == '\0') {
              uVar17 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),
                                   *(uint *)(lVar24 + 8 + lVar31 * 4));
              uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + lVar31 * 4));
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
            }
            else {
              if (*(char *)(lVar27 + lVar31) == '\0') {
                uVar17 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),
                                     *(uint *)(lVar24 + 8 + lVar31 * 4));
                uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
              }
              else {
                uVar17 = *(uint *)(lVar24 + 8 + lVar31 * 4);
                uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
              }
              uVar17 = UFPC::Merge(uVar17,uVar6);
              *(uint *)(lVar1 + lVar31 * 4) = uVar17;
            }
          }
          else {
            if (*(char *)(lVar27 + 1 + lVar31) == '\0') {
              uVar17 = UFPC::Merge(*(uint *)(lVar24 + lVar31 * 4),*(uint *)(lVar24 + 8 + lVar31 * 4)
                                  );
              uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
            }
            else {
              uVar17 = *(uint *)(lVar24 + 8 + lVar31 * 4);
              uVar6 = *(uint *)(lVar1 + -8 + lVar31 * 4);
            }
            uVar17 = UFPC::Merge(uVar17,uVar6);
            *(uint *)(lVar1 + lVar31 * 4) = uVar17;
          }
          goto LAB_001555ed;
        }
        uVar14 = local_d0 & 0xffffffff;
        if (local_a8 < iVar22) {
          if (*(char *)(lVar11 + uVar14) == '\0') {
LAB_00154cec:
            local_d0 = local_d0 & 0xffffffff;
            goto LAB_0015634a;
          }
          if (*(char *)(lVar39 + 1 + lVar31) == '\0') {
LAB_00154d83:
            uVar25 = (ulong)(int)local_d0;
            if (*(char *)(lVar44 + uVar25) != '\0') goto LAB_0015406b;
            if (*(char *)(lVar44 + -1 + uVar25) == '\0') goto LAB_001570d8;
            uVar8 = *(undefined4 *)(lVar24 + -8 + uVar25 * 4);
            goto LAB_00156e8d;
          }
LAB_00154ccc:
          uVar25 = (ulong)iVar22;
          if (*(char *)(lVar44 + -1 + uVar25) == '\0') goto LAB_00154ddf;
          uVar17 = *(uint *)(lVar24 + -8 + uVar25 * 4);
        }
        else if (*(char *)(lVar11 + uVar14) == '\0') {
LAB_00154da7:
          iVar22 = (int)local_d0;
          if (*(char *)(lVar39 + uVar14) == '\0') goto LAB_001570ba;
          uVar25 = (ulong)iVar22;
          if (*(char *)(lVar11 + 1 + uVar25) == '\0') goto LAB_00156357;
LAB_00154dc4:
          uVar17 = (uint)local_d0;
          if (*(char *)(lVar39 + -1 + uVar25) == '\0') goto LAB_00153fef;
LAB_00154dd7:
          if (*(char *)(lVar44 + 1 + uVar25) == '\0') {
LAB_00154ddf:
            if (*(char *)(lVar44 + uVar25) == '\0') {
              uVar17 = *(uint *)(lVar1 + -8 + uVar25 * 4);
              goto LAB_00156dbb;
            }
          }
          uVar17 = *(uint *)(lVar24 + uVar25 * 4);
        }
        else {
          if (*(char *)(lVar39 + 1 + lVar31) == '\0') {
LAB_00154d5c:
            uVar25 = (ulong)(int)local_d0;
            if (*(char *)(lVar44 + 1 + uVar25) == '\0') goto LAB_00154d83;
            if ((*(char *)(lVar44 + uVar25) != '\0') || (*(char *)(lVar44 + -1 + uVar25) == '\0'))
            goto LAB_00156db7;
            goto LAB_00156da7;
          }
LAB_00154ca8:
          uVar25 = (ulong)iVar22;
          if (*(char *)(lVar44 + 1 + uVar25) == '\0') goto LAB_00154ccc;
          if ((*(char *)(lVar44 + uVar25) == '\0') && (*(char *)(lVar44 + -1 + uVar25) != '\0')) {
            if (*(char *)(lVar27 + uVar25) == '\0') {
              uVar17 = UFPC::Merge(*(uint *)(lVar24 + -8 + uVar25 * 4),
                                   *(uint *)(lVar24 + uVar25 * 4));
              uVar6 = *(uint *)(lVar1 + -8 + uVar25 * 4);
            }
            else {
              uVar17 = *(uint *)(lVar24 + uVar25 * 4);
              uVar6 = *(uint *)(lVar1 + -8 + uVar25 * 4);
            }
            uVar17 = UFPC::Merge(uVar17,uVar6);
            *(uint *)(lVar1 + uVar25 * 4) = uVar17;
            goto LAB_0015712a;
          }
          uVar17 = *(uint *)(lVar24 + uVar25 * 4);
        }
        uVar6 = *(uint *)(lVar1 + -8 + uVar25 * 4);
        goto LAB_00154df4;
      }
      uVar25 = local_d0;
      local_d0 = local_d0 & 0xffffffff;
LAB_00156f36:
      uVar14 = local_d0 & 0xffffffff;
      if (*(char *)(lVar44 + 1 + uVar25) != '\0') goto LAB_00156f4e;
      goto LAB_001561e8;
    }
LAB_0015619b:
    uVar25 = (ulong)(int)local_d0;
    if (*(char *)(uVar25 + 1 + lVar44) != '\0') {
      local_d0 = local_d0 & 0xffffffff;
      goto LAB_001561bb;
    }
    uVar14 = local_d0;
    if (*(char *)(lVar11 + 1 + uVar25) != '\0') goto LAB_001561e8;
    *(undefined4 *)(lVar1 + uVar25 * 4) = *(undefined4 *)(lVar1 + -8 + uVar25 * 4);
  } while( true );
LAB_0015556f:
  *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
  goto LAB_00154bae;
LAB_001554d9:
  local_d0 = local_d0 & 0xffffffff;
LAB_00154233:
  uVar17 = UFPC::length_;
  lVar31 = (long)(int)local_d0;
  if (*(char *)(lVar39 + 1 + lVar31) != '\0') {
    UFPC::P_[UFPC::length_] = UFPC::length_;
    uVar6 = UFPC::length_ + 1;
    *(uint *)(lVar1 + lVar31 * 4) = UFPC::length_;
    UFPC::length_ = uVar6;
    local_d0 = lVar31 + 2;
    iVar22 = (int)local_d0;
    if (iVar22 < local_a8) {
      if (*(char *)(lVar11 + local_d0) != '\0') goto LAB_00154bdd;
      if (*(char *)(lVar39 + local_d0) == '\0') {
        local_d0 = local_d0 & 0xffffffff;
        goto LAB_001540e5;
      }
      if (*(char *)(lVar11 + 3 + lVar31) != '\0') {
        uVar25 = local_d0 & 0xffffffff;
        goto LAB_0015465f;
      }
      *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
      local_d0 = local_d0 & 0xffffffff;
      goto LAB_00154bae;
    }
    uVar25 = local_d0 & 0xffffffff;
    if (local_a8 < iVar22) {
      if (*(char *)(lVar11 + uVar25) != '\0') goto LAB_00154ccc;
      uVar25 = (ulong)iVar22;
      goto LAB_00155b5b;
    }
    if (*(char *)(lVar11 + uVar25) != '\0') goto LAB_00154ca8;
    if (*(char *)(lVar39 + uVar25) == '\0') goto LAB_001570ba;
    if (*(char *)(lVar11 + 3 + lVar31) != '\0') {
      uVar25 = (ulong)iVar22;
      goto LAB_00154dd7;
    }
    *(uint *)(lVar1 + uVar25 * 4) = uVar17;
    goto LAB_0015712a;
  }
  *(undefined4 *)(lVar1 + lVar31 * 4) = 0;
  local_d0 = lVar31 + 2;
  if (local_a8 <= (int)local_d0) {
    cVar2 = *(char *)(lVar11 + (local_d0 & 0xffffffff));
    if (local_a8 < (int)local_d0) {
      if (cVar2 == '\0') goto LAB_001542d3;
      goto LAB_00154d83;
    }
    if (cVar2 == '\0') goto LAB_00154312;
    goto LAB_00154d5c;
  }
  if (*(char *)(lVar11 + local_d0) == '\0') {
LAB_001540bf:
    lVar31 = (long)(int)local_d0;
    if (*(char *)(lVar39 + lVar31) == '\0') goto LAB_001540e5;
    if (*(char *)(lVar11 + 1 + lVar31) == '\0') goto LAB_00154b84;
    uVar25 = local_d0 & 0xffffffff;
    goto LAB_001540f9;
  }
LAB_0015437e:
  iVar22 = (int)local_d0;
  lVar31 = (long)iVar22;
  if (*(char *)(lVar31 + 1 + lVar44) != '\0') {
    if ((*(char *)(lVar44 + lVar31) == '\0') && (*(char *)(lVar44 + -1 + lVar31) != '\0')) {
      local_d0 = local_d0 & 0xffffffff;
      goto LAB_00157038;
    }
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
    local_d0 = local_d0 & 0xffffffff;
    goto LAB_00156bde;
  }
  if (*(char *)(lVar11 + 1 + lVar31) != '\0') {
    lVar31 = (long)iVar22;
    if (*(char *)(lVar44 + 2 + lVar31) != '\0') {
      if (*(char *)(lVar44 + lVar31) != '\0') goto LAB_001543e2;
      if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
        *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + 8 + lVar31 * 4);
      }
      else {
LAB_00157380:
        if ((*(char *)(lVar27 + 1 + lVar31) == '\0') || (*(char *)(lVar27 + lVar31) == '\0')) {
          uVar17 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),
                               *(uint *)(lVar24 + 8 + lVar31 * 4));
          *(uint *)(lVar1 + lVar31 * 4) = uVar17;
        }
        else {
          *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + 8 + lVar31 * 4);
        }
      }
      goto LAB_001555ed;
    }
    if (*(char *)(lVar44 + lVar31) != '\0') {
      *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
      goto LAB_001547ad;
    }
    if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
      UFPC::P_[UFPC::length_] = UFPC::length_;
      uVar17 = UFPC::length_ + 1;
      *(uint *)(lVar1 + lVar31 * 4) = UFPC::length_;
      UFPC::length_ = uVar17;
    }
    else {
      *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + -8 + lVar31 * 4);
    }
    goto LAB_00155368;
  }
  lVar31 = (long)iVar22;
  if (*(char *)(lVar44 + lVar31) == '\0') {
    if (*(char *)(lVar44 + -1 + lVar31) == '\0') {
      UFPC::P_[UFPC::length_] = UFPC::length_;
      uVar17 = UFPC::length_ + 1;
      *(uint *)(lVar1 + lVar31 * 4) = UFPC::length_;
      UFPC::length_ = uVar17;
    }
    else {
      *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + -8 + lVar31 * 4);
    }
    local_d0 = local_d0 & 0xffffffff;
    goto LAB_00154551;
  }
  *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
  local_d0 = local_d0 & 0xffffffff;
LAB_00155242:
  while( true ) {
    lVar31 = (long)(int)local_d0;
    local_d0 = lVar31 + 2;
    if (local_a8 <= (int)local_d0) {
      uVar14 = local_d0 & 0xffffffff;
      if (local_a8 < (int)local_d0) {
        if (*(char *)(lVar11 + uVar14) == '\0') goto LAB_0015634a;
        if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_0015633d;
      }
      else {
        if (*(char *)(lVar11 + uVar14) == '\0') {
          if (*(char *)(lVar39 + uVar14) == '\0') goto LAB_0015665f;
          if (*(char *)(lVar11 + 3 + lVar31) == '\0') goto LAB_00156654;
        }
        if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_001563f6;
        if (*(char *)(lVar44 + 3 + lVar31) != '\0') goto LAB_001563d9;
      }
      if (*(char *)(lVar44 + uVar14) != '\0') goto LAB_001565ad;
      goto LAB_001565f2;
    }
    if (*(char *)(lVar11 + local_d0) == '\0') break;
    uVar25 = local_d0;
    if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_00154030;
    if (*(char *)(lVar31 + 3 + lVar44) != '\0') goto LAB_001562af;
    if (*(char *)(lVar11 + 3 + lVar31) != '\0') goto LAB_0015531b;
    if (*(char *)(lVar44 + local_d0) == '\0') {
LAB_0015680e:
      *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
LAB_00154551:
      while( true ) {
        lVar31 = (long)(int)local_d0;
        uVar25 = lVar31 + 2;
        iVar22 = (int)uVar25;
        local_d0 = uVar25;
        if (local_a8 <= iVar22) {
          uVar14 = uVar25 & 0xffffffff;
          if (iVar22 <= local_a8) {
            if (*(char *)(lVar11 + uVar14) == '\0') goto LAB_00154da7;
            uVar25 = (ulong)iVar22;
            goto LAB_00154dc4;
          }
          if (*(char *)(lVar11 + uVar14) == '\0') goto LAB_00154cec;
          if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_00156340;
          uVar25 = (ulong)iVar22;
          goto LAB_00154ddf;
        }
        if (*(char *)(lVar11 + uVar25) == '\0') goto LAB_0015463f;
        if (*(char *)(lVar39 + 1 + lVar31) == '\0') {
          uVar25 = uVar25 & 0xffffffff;
          goto LAB_00154030;
        }
        if (*(char *)(lVar31 + 3 + lVar44) != '\0') {
          uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + lVar31 * 4));
          *(uint *)(lVar1 + 8 + lVar31 * 4) = uVar17;
          local_d0 = uVar25 & 0xffffffff;
          goto LAB_00156bde;
        }
        if (*(char *)(lVar11 + 3 + lVar31) != '\0') goto LAB_001546db;
LAB_00155056:
        local_d0 = local_d0 & 0xffffffff;
        if (*(char *)(lVar44 + uVar25) != '\0') break;
        *(undefined4 *)(lVar1 + uVar25 * 4) = *(undefined4 *)(lVar1 + -8 + uVar25 * 4);
      }
      uVar17 = UFPC::Merge(*(uint *)(lVar24 + uVar25 * 4),*(uint *)(lVar1 + -8 + uVar25 * 4));
      *(uint *)(lVar1 + uVar25 * 4) = uVar17;
    }
    else {
LAB_001567dc:
      uVar17 = *(uint *)(lVar24 + local_d0 * 4);
      if (*(char *)(lVar27 + -1 + local_d0) == '\0') {
        uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + local_d0 * 4));
        *(uint *)(lVar1 + local_d0 * 4) = uVar17;
      }
      else {
        *(uint *)(lVar1 + local_d0 * 4) = uVar17;
      }
    }
  }
  if (*(char *)(lVar39 + local_d0) == '\0') goto LAB_0015652c;
  uVar25 = local_d0;
  if (*(char *)(lVar31 + 3 + lVar11) == '\0') goto LAB_00154b6a;
  if (*(char *)(lVar39 + 1 + lVar31) == '\0') goto LAB_001540f9;
  if (*(char *)(lVar44 + 3 + lVar31) != '\0') goto LAB_001564bd;
LAB_0015531b:
  if (*(char *)(lVar31 + 4 + lVar44) != '\0') {
    uVar25 = local_d0;
    if (*(char *)(lVar27 + 3 + lVar31) != '\0') goto LAB_001566a3;
    if (*(char *)(lVar44 + local_d0) != '\0') goto LAB_0015693b;
    goto LAB_00156980;
  }
  uVar25 = local_d0;
  if (*(char *)(lVar44 + local_d0) != '\0') goto LAB_00156830;
LAB_00156862:
  *(undefined4 *)(lVar1 + 8 + lVar31 * 4) = *(undefined4 *)(lVar1 + lVar31 * 4);
  local_d0 = local_d0 & 0xffffffff;
  goto LAB_00155368;
LAB_0015652c:
  local_d0 = local_d0 & 0xffffffff;
  goto LAB_001540e5;
LAB_001564bd:
  if (*(char *)(lVar27 + -1 + local_d0) == '\0') {
    uVar17 = UFPC::Merge(*(uint *)(lVar24 + local_d0 * 4),*(uint *)(lVar1 + -8 + local_d0 * 4));
    *(uint *)(lVar1 + local_d0 * 4) = uVar17;
  }
  else {
LAB_00156f4e:
    lVar31 = (long)(int)local_d0;
    if (*(char *)(lVar44 + lVar31) == '\0') {
      uVar17 = *(uint *)(lVar24 + lVar31 * 4);
      if (*(char *)(lVar27 + lVar31) == '\0') {
        uVar17 = UFPC::Merge(uVar17,*(uint *)(lVar1 + -8 + lVar31 * 4));
        *(uint *)(lVar1 + lVar31 * 4) = uVar17;
      }
      else {
        *(uint *)(lVar1 + lVar31 * 4) = uVar17;
      }
    }
    else {
      *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
    }
  }
  goto LAB_0015410d;
LAB_0015463f:
  local_d0 = (ulong)(int)uVar25;
  if (*(char *)(lVar39 + local_d0) != '\0') {
    if (*(char *)(lVar11 + 1 + local_d0) == '\0') goto LAB_00154b6a;
    if (*(char *)(lVar39 + -1 + local_d0) != '\0') {
LAB_0015465f:
      if (*(char *)(lVar44 + 1 + local_d0) != '\0') {
        uVar17 = UFPC::Merge(*(uint *)(lVar24 + local_d0 * 4),*(uint *)(lVar1 + -8 + local_d0 * 4));
        *(uint *)(lVar1 + local_d0 * 4) = uVar17;
        local_d0 = uVar25;
        goto LAB_0015410d;
      }
LAB_001546db:
      lVar31 = (long)(int)uVar25;
      if (*(char *)(lVar31 + 2 + lVar44) == '\0') {
        local_d0 = uVar25 & 0xffffffff;
        goto LAB_00154752;
      }
      if (*(char *)(lVar27 + 1 + lVar31) == '\0') {
        if (*(char *)(lVar44 + lVar31) == '\0') {
          uVar6 = *(uint *)(lVar24 + 8 + lVar31 * 4);
          uVar17 = *(uint *)(lVar1 + -8 + lVar31 * 4);
        }
        else {
          uVar6 = UFPC::Merge(*(uint *)(lVar24 + lVar31 * 4),*(uint *)(lVar24 + 8 + lVar31 * 4));
          uVar17 = *(uint *)(lVar1 + -8 + lVar31 * 4);
        }
        uVar17 = UFPC::Merge(uVar6,uVar17);
        *(uint *)(lVar1 + lVar31 * 4) = uVar17;
        local_d0 = uVar25 & 0xffffffff;
      }
      else {
        uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar31 * 4),*(uint *)(lVar1 + -8 + lVar31 * 4));
        *(uint *)(lVar1 + lVar31 * 4) = uVar17;
        local_d0 = uVar25 & 0xffffffff;
      }
      goto LAB_001555ed;
    }
    goto LAB_001540f9;
  }
  local_d0 = uVar25 & 0xffffffff;
LAB_001540e5:
  uVar25 = local_d0 & 0xffffffff;
  if (*(char *)(lVar11 + 1 + (long)(int)local_d0) != '\0') goto LAB_001540f9;
  goto LAB_00154233;
LAB_00154b6a:
  local_d0 = uVar25 & 0xffffffff;
  lVar31 = (long)(int)uVar25;
  if (*(char *)(lVar39 + -1 + lVar31) == '\0') {
LAB_00154b84:
    UFPC::P_[UFPC::length_] = UFPC::length_;
    uVar17 = UFPC::length_ + 1;
    *(uint *)(lVar1 + lVar31 * 4) = UFPC::length_;
    UFPC::length_ = uVar17;
  }
  else {
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar1 + -8 + lVar31 * 4);
  }
  goto LAB_00154bae;
LAB_001540f9:
  lVar31 = (long)(int)uVar25;
  local_d0 = uVar25;
  if (*(char *)(lVar44 + 1 + lVar31) != '\0') {
LAB_00154104:
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
    local_d0 = uVar25;
    goto LAB_0015410d;
  }
LAB_00154165:
  lVar31 = (long)(int)local_d0;
  if (*(char *)(lVar44 + 2 + lVar31) != '\0') {
    if (*(char *)(lVar44 + lVar31) != '\0') goto LAB_001543e2;
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + 8 + lVar31 * 4);
    goto LAB_001555ed;
  }
  if (*(char *)(lVar44 + lVar31) != '\0') {
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
    goto LAB_001547ad;
  }
  UFPC::P_[UFPC::length_] = UFPC::length_;
  uVar17 = UFPC::length_ + 1;
  *(uint *)(lVar1 + lVar31 * 4) = UFPC::length_;
  UFPC::length_ = uVar17;
  goto LAB_00155368;
LAB_001561e8:
  local_d0 = uVar14;
  if (*(char *)(lVar44 + 2 + uVar25) != '\0') {
LAB_001561fc:
    if (*(char *)(lVar27 + 1 + uVar25) != '\0') goto LAB_00156212;
    uVar17 = UFPC::Merge(*(uint *)(lVar24 + 8 + uVar25 * 4),*(uint *)(lVar1 + -8 + uVar25 * 4));
    goto LAB_00156560;
  }
  *(undefined4 *)(lVar1 + uVar25 * 4) = *(undefined4 *)(lVar1 + -8 + uVar25 * 4);
  goto LAB_00155a1d;
LAB_00156fef:
  local_d0 = (ulong)(uint)(iVar13 + (int)lVar15);
  lVar31 = lVar36 + 0x200000000 >> 0x20;
LAB_00157038:
  if (*(char *)(lVar27 + lVar31) == '\0') {
    uVar17 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar31 * 4),*(uint *)(lVar24 + lVar31 * 4));
    *(uint *)(lVar1 + lVar31 * 4) = uVar17;
  }
  else {
    *(undefined4 *)(lVar1 + lVar31 * 4) = *(undefined4 *)(lVar24 + lVar31 * 4);
  }
  goto LAB_00156bde;
code_r0x00157b6f:
  if (*(char *)(lVar1 + lVar34) == '\0') {
    uVar25 = (ulong)(uint)(iVar13 + iVar38);
    *(undefined4 *)(lVar39 + lVar34 * 4) = *(undefined4 *)(lVar29 + (lVar12 >> 0x1e));
    goto LAB_00157ce9;
  }
  uVar19 = *(uint *)(lVar10 + lVar34 * 4);
  if (*(char *)(lVar16 + lVar42 + lVar34) == '\0') {
    uVar19 = UFPC::Merge(uVar19,*(uint *)(lVar39 + -8 + lVar34 * 4));
  }
  *(uint *)(lVar39 + lVar34 * 4) = uVar19;
  lVar12 = lVar12 + 0x200000000;
  lVar15 = lVar42 + lVar34;
  lVar34 = lVar34 + 2;
  if ((long)uVar20 <= lVar15 + 4) {
    uVar19 = iVar22 + (int)lVar34 + 2;
    iVar22 = iVar22 + (int)lVar34;
    goto LAB_001582c4;
  }
  goto LAB_00157b4c;
code_r0x00157fb7:
  *(undefined4 *)(lVar42 + lVar12 * 4) = *(undefined4 *)(lVar1 + -8 + lVar12 * 4);
  lVar9 = lVar39 + lVar12;
  lVar12 = lVar12 + 2;
  if ((long)uVar20 <= lVar9 + 2) {
    iVar13 = iVar22 + (int)lVar12 + 2;
    iVar22 = iVar22 + (int)lVar12;
    goto LAB_00158272;
  }
  goto LAB_00157f92;
LAB_00157ab8:
  *(undefined4 *)(lVar29 + uVar14 * 4) = *(undefined4 *)(lVar41 + 8 + uVar14 * 4);
  uVar14 = uVar25;
  goto LAB_00157ae3;
LAB_00153b05:
  uVar8 = 0;
LAB_00153b1a:
  *(undefined4 *)(lVar29 + lVar23 * 4) = uVar8;
LAB_00153b1e:
  uVar19 = uVar28 + 2;
  uVar20 = (ulong)uVar19;
  if ((int)uVar17 <= (int)uVar19) goto LAB_00153b2d;
  goto LAB_00153a6f;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}